

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx512::CurveNiMBIntersectorK<4,8>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  Primitive PVar5;
  uint uVar6;
  uint uVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [28];
  undefined1 auVar34 [28];
  undefined1 auVar35 [28];
  undefined1 auVar36 [28];
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  byte bVar44;
  uint uVar45;
  ulong uVar46;
  long lVar48;
  long lVar49;
  uint uVar50;
  ulong uVar51;
  uint uVar52;
  ulong uVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  undefined1 auVar103 [32];
  undefined1 auVar105 [32];
  undefined1 auVar107 [32];
  undefined1 auVar76 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  int iVar115;
  float fVar116;
  undefined4 uVar117;
  vint4 bi_2;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  vint4 bi_1;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  vint4 bi;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  vfloat4 a0;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  vint4 ai_2;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  vint4 ai_1;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  float fVar176;
  float fVar191;
  vint4 ai;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  float fVar192;
  float fVar205;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar206;
  float fVar224;
  float fVar225;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  float fVar226;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  float fVar233;
  float fVar234;
  float fVar246;
  float fVar248;
  vfloat4 a0_3;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar247;
  float fVar249;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar260;
  vfloat4 b0_2;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  vfloat4 a0_4;
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [64];
  undefined1 auVar289 [64];
  undefined1 in_ZMM23 [64];
  undefined1 auVar290 [64];
  undefined1 auVar291 [64];
  undefined1 auVar292 [64];
  undefined1 auVar293 [64];
  int iVar294;
  undefined1 in_ZMM31 [64];
  undefined1 auVar295 [64];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  RTCFilterFunctionNArguments local_4a0;
  undefined1 local_470 [16];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  uint auStack_410 [4];
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [8];
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [8];
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [16];
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  uint uStack_260;
  float afStack_25c [7];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar47;
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  undefined1 auVar104 [32];
  undefined1 auVar106 [32];
  undefined1 auVar108 [32];
  uint uVar114;
  undefined1 auVar276 [32];
  
  PVar5 = prim[1];
  uVar46 = (ulong)(byte)PVar5;
  lVar49 = uVar46 * 0x25;
  fVar116 = *(float *)(prim + lVar49 + 0x12);
  auVar54 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar54 = vinsertps_avx(auVar54,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar55 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar55 = vinsertps_avx(auVar55,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar54 = vsubps_avx(auVar54,*(undefined1 (*) [16])(prim + lVar49 + 6));
  auVar76._0_4_ = fVar116 * auVar54._0_4_;
  auVar76._4_4_ = fVar116 * auVar54._4_4_;
  auVar76._8_4_ = fVar116 * auVar54._8_4_;
  auVar76._12_4_ = fVar116 * auVar54._12_4_;
  auVar54 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar46 * 4 + 6)));
  auVar58._0_4_ = fVar116 * auVar55._0_4_;
  auVar58._4_4_ = fVar116 * auVar55._4_4_;
  auVar58._8_4_ = fVar116 * auVar55._8_4_;
  auVar58._12_4_ = fVar116 * auVar55._12_4_;
  auVar54 = vcvtdq2ps_avx(auVar54);
  auVar55 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar46 * 5 + 6)));
  auVar55 = vcvtdq2ps_avx(auVar55);
  auVar56 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar46 * 6 + 6)));
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar46 * 0xf + 6)));
  auVar56 = vcvtdq2ps_avx(auVar56);
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar5 * 0x10 + 6)));
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar68 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar46 + 6)));
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar46 * 0x1a + 6)));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar46 * 0x1b + 6)));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar46 * 0x1c + 6)));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar163._4_4_ = auVar58._0_4_;
  auVar163._0_4_ = auVar58._0_4_;
  auVar163._8_4_ = auVar58._0_4_;
  auVar163._12_4_ = auVar58._0_4_;
  auVar73 = vshufps_avx(auVar58,auVar58,0x55);
  auVar74 = vshufps_avx(auVar58,auVar58,0xaa);
  fVar116 = auVar74._0_4_;
  auVar67._0_4_ = fVar116 * auVar56._0_4_;
  fVar252 = auVar74._4_4_;
  auVar67._4_4_ = fVar252 * auVar56._4_4_;
  fVar234 = auVar74._8_4_;
  auVar67._8_4_ = fVar234 * auVar56._8_4_;
  fVar247 = auVar74._12_4_;
  auVar67._12_4_ = fVar247 * auVar56._12_4_;
  auVar64._0_4_ = auVar68._0_4_ * fVar116;
  auVar64._4_4_ = auVar68._4_4_ * fVar252;
  auVar64._8_4_ = auVar68._8_4_ * fVar234;
  auVar64._12_4_ = auVar68._12_4_ * fVar247;
  auVar59._0_4_ = auVar72._0_4_ * fVar116;
  auVar59._4_4_ = auVar72._4_4_ * fVar252;
  auVar59._8_4_ = auVar72._8_4_ * fVar234;
  auVar59._12_4_ = auVar72._12_4_ * fVar247;
  auVar74 = vfmadd231ps_fma(auVar67,auVar73,auVar55);
  auVar24 = vfmadd231ps_fma(auVar64,auVar73,auVar71);
  auVar73 = vfmadd231ps_fma(auVar59,auVar70,auVar73);
  auVar25 = vfmadd231ps_fma(auVar74,auVar163,auVar54);
  auVar24 = vfmadd231ps_fma(auVar24,auVar163,auVar65);
  auVar26 = vfmadd231ps_fma(auVar73,auVar69,auVar163);
  auVar277._4_4_ = auVar76._0_4_;
  auVar277._0_4_ = auVar76._0_4_;
  auVar277._8_4_ = auVar76._0_4_;
  auVar277._12_4_ = auVar76._0_4_;
  auVar73 = vshufps_avx(auVar76,auVar76,0x55);
  auVar74 = vshufps_avx(auVar76,auVar76,0xaa);
  fVar116 = auVar74._0_4_;
  auVar164._0_4_ = fVar116 * auVar56._0_4_;
  fVar252 = auVar74._4_4_;
  auVar164._4_4_ = fVar252 * auVar56._4_4_;
  fVar234 = auVar74._8_4_;
  auVar164._8_4_ = fVar234 * auVar56._8_4_;
  fVar247 = auVar74._12_4_;
  auVar164._12_4_ = fVar247 * auVar56._12_4_;
  auVar152._0_4_ = auVar68._0_4_ * fVar116;
  auVar152._4_4_ = auVar68._4_4_ * fVar252;
  auVar152._8_4_ = auVar68._8_4_ * fVar234;
  auVar152._12_4_ = auVar68._12_4_ * fVar247;
  auVar141._0_4_ = auVar72._0_4_ * fVar116;
  auVar141._4_4_ = auVar72._4_4_ * fVar252;
  auVar141._8_4_ = auVar72._8_4_ * fVar234;
  auVar141._12_4_ = auVar72._12_4_ * fVar247;
  auVar55 = vfmadd231ps_fma(auVar164,auVar73,auVar55);
  auVar56 = vfmadd231ps_fma(auVar152,auVar73,auVar71);
  auVar71 = vfmadd231ps_fma(auVar141,auVar73,auVar70);
  auVar57 = vfmadd231ps_fma(auVar55,auVar277,auVar54);
  auVar58 = vfmadd231ps_fma(auVar56,auVar277,auVar65);
  auVar95._16_16_ = in_YmmResult._16_16_;
  auVar54 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar290 = ZEXT1664(auVar54);
  auVar59 = vfmadd231ps_fma(auVar71,auVar277,auVar69);
  auVar55 = vandps_avx512vl(auVar25,auVar54);
  auVar193._8_4_ = 0x219392ef;
  auVar193._0_8_ = 0x219392ef219392ef;
  auVar193._12_4_ = 0x219392ef;
  uVar53 = vcmpps_avx512vl(auVar55,auVar193,1);
  bVar14 = (bool)((byte)uVar53 & 1);
  auVar60._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar25._0_4_;
  bVar14 = (bool)((byte)(uVar53 >> 1) & 1);
  auVar60._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar25._4_4_;
  bVar14 = (bool)((byte)(uVar53 >> 2) & 1);
  auVar60._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar25._8_4_;
  bVar14 = (bool)((byte)(uVar53 >> 3) & 1);
  auVar60._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar25._12_4_;
  auVar55 = vandps_avx512vl(auVar24,auVar54);
  uVar53 = vcmpps_avx512vl(auVar55,auVar193,1);
  bVar14 = (bool)((byte)uVar53 & 1);
  auVar61._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar24._0_4_;
  bVar14 = (bool)((byte)(uVar53 >> 1) & 1);
  auVar61._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar24._4_4_;
  bVar14 = (bool)((byte)(uVar53 >> 2) & 1);
  auVar61._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar24._8_4_;
  bVar14 = (bool)((byte)(uVar53 >> 3) & 1);
  auVar61._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar24._12_4_;
  auVar54 = vandps_avx512vl(auVar26,auVar54);
  uVar53 = vcmpps_avx512vl(auVar54,auVar193,1);
  bVar14 = (bool)((byte)uVar53 & 1);
  auVar62._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar26._0_4_;
  bVar14 = (bool)((byte)(uVar53 >> 1) & 1);
  auVar62._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar26._4_4_;
  bVar14 = (bool)((byte)(uVar53 >> 2) & 1);
  auVar62._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar26._8_4_;
  bVar14 = (bool)((byte)(uVar53 >> 3) & 1);
  auVar62._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar26._12_4_;
  auVar54 = vrcp14ps_avx512vl(auVar60);
  auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar291 = ZEXT1664(auVar55);
  auVar56 = vfnmadd213ps_avx512vl(auVar60,auVar54,auVar55);
  auVar25 = vfmadd132ps_fma(auVar56,auVar54,auVar54);
  auVar54 = vrcp14ps_avx512vl(auVar61);
  auVar56 = vfnmadd213ps_avx512vl(auVar61,auVar54,auVar55);
  auVar26 = vfmadd132ps_fma(auVar56,auVar54,auVar54);
  auVar54 = vrcp14ps_avx512vl(auVar62);
  auVar55 = vfnmadd213ps_avx512vl(auVar62,auVar54,auVar55);
  auVar75 = vfmadd132ps_fma(auVar55,auVar54,auVar54);
  fVar116 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar49 + 0x16)) *
            *(float *)(prim + lVar49 + 0x1a);
  auVar177._4_4_ = fVar116;
  auVar177._0_4_ = fVar116;
  auVar177._8_4_ = fVar116;
  auVar177._12_4_ = fVar116;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar46 * 7 + 6);
  auVar54 = vpmovsxwd_avx(auVar54);
  auVar54 = vcvtdq2ps_avx(auVar54);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + uVar46 * 0xb + 6);
  auVar55 = vpmovsxwd_avx(auVar55);
  auVar55 = vcvtdq2ps_avx(auVar55);
  auVar65 = vsubps_avx(auVar55,auVar54);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + uVar46 * 9 + 6);
  auVar55 = vpmovsxwd_avx(auVar56);
  auVar56 = vfmadd213ps_fma(auVar65,auVar177,auVar54);
  auVar54 = vcvtdq2ps_avx(auVar55);
  auVar65._8_8_ = 0;
  auVar65._0_8_ = *(ulong *)(prim + uVar46 * 0xd + 6);
  auVar55 = vpmovsxwd_avx(auVar65);
  auVar55 = vcvtdq2ps_avx(auVar55);
  auVar55 = vsubps_avx(auVar55,auVar54);
  auVar65 = vfmadd213ps_fma(auVar55,auVar177,auVar54);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar46 * 0x12 + 6);
  auVar54 = vpmovsxwd_avx(auVar71);
  auVar54 = vcvtdq2ps_avx(auVar54);
  uVar53 = (ulong)(uint)((int)(uVar46 * 5) << 2);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + uVar46 * 2 + uVar53 + 6);
  auVar55 = vpmovsxwd_avx(auVar68);
  auVar55 = vcvtdq2ps_avx(auVar55);
  auVar55 = vsubps_avx(auVar55,auVar54);
  auVar71 = vfmadd213ps_fma(auVar55,auVar177,auVar54);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar53 + 6);
  auVar54 = vpmovsxwd_avx(auVar69);
  auVar54 = vcvtdq2ps_avx(auVar54);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar46 * 0x18 + 6);
  auVar55 = vpmovsxwd_avx(auVar70);
  auVar55 = vcvtdq2ps_avx(auVar55);
  auVar55 = vsubps_avx(auVar55,auVar54);
  auVar68 = vfmadd213ps_fma(auVar55,auVar177,auVar54);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar46 * 0x1d + 6);
  auVar54 = vpmovsxwd_avx(auVar72);
  auVar54 = vcvtdq2ps_avx(auVar54);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar46 + (ulong)(byte)PVar5 * 0x20 + 6);
  auVar55 = vpmovsxwd_avx(auVar73);
  auVar55 = vcvtdq2ps_avx(auVar55);
  auVar55 = vsubps_avx(auVar55,auVar54);
  auVar69 = vfmadd213ps_fma(auVar55,auVar177,auVar54);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar5 * 0x20 - uVar46) + 6);
  auVar54 = vpmovsxwd_avx(auVar74);
  auVar54 = vcvtdq2ps_avx(auVar54);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar46 * 0x23 + 6);
  auVar55 = vpmovsxwd_avx(auVar24);
  auVar55 = vcvtdq2ps_avx(auVar55);
  auVar55 = vsubps_avx(auVar55,auVar54);
  auVar55 = vfmadd213ps_fma(auVar55,auVar177,auVar54);
  auVar54 = vsubps_avx(auVar56,auVar57);
  auVar178._0_4_ = auVar25._0_4_ * auVar54._0_4_;
  auVar178._4_4_ = auVar25._4_4_ * auVar54._4_4_;
  auVar178._8_4_ = auVar25._8_4_ * auVar54._8_4_;
  auVar178._12_4_ = auVar25._12_4_ * auVar54._12_4_;
  auVar54 = vsubps_avx(auVar65,auVar57);
  auVar133._0_4_ = auVar25._0_4_ * auVar54._0_4_;
  auVar133._4_4_ = auVar25._4_4_ * auVar54._4_4_;
  auVar133._8_4_ = auVar25._8_4_ * auVar54._8_4_;
  auVar133._12_4_ = auVar25._12_4_ * auVar54._12_4_;
  auVar54 = vsubps_avx(auVar71,auVar58);
  auVar165._0_4_ = auVar26._0_4_ * auVar54._0_4_;
  auVar165._4_4_ = auVar26._4_4_ * auVar54._4_4_;
  auVar165._8_4_ = auVar26._8_4_ * auVar54._8_4_;
  auVar165._12_4_ = auVar26._12_4_ * auVar54._12_4_;
  auVar54 = vsubps_avx(auVar68,auVar58);
  auVar66._0_4_ = auVar26._0_4_ * auVar54._0_4_;
  auVar66._4_4_ = auVar26._4_4_ * auVar54._4_4_;
  auVar66._8_4_ = auVar26._8_4_ * auVar54._8_4_;
  auVar66._12_4_ = auVar26._12_4_ * auVar54._12_4_;
  auVar54 = vsubps_avx(auVar69,auVar59);
  auVar153._0_4_ = auVar75._0_4_ * auVar54._0_4_;
  auVar153._4_4_ = auVar75._4_4_ * auVar54._4_4_;
  auVar153._8_4_ = auVar75._8_4_ * auVar54._8_4_;
  auVar153._12_4_ = auVar75._12_4_ * auVar54._12_4_;
  auVar54 = vsubps_avx(auVar55,auVar59);
  auVar63._0_4_ = auVar75._0_4_ * auVar54._0_4_;
  auVar63._4_4_ = auVar75._4_4_ * auVar54._4_4_;
  auVar63._8_4_ = auVar75._8_4_ * auVar54._8_4_;
  auVar63._12_4_ = auVar75._12_4_ * auVar54._12_4_;
  auVar54 = vpminsd_avx(auVar178,auVar133);
  auVar55 = vpminsd_avx(auVar165,auVar66);
  auVar54 = vmaxps_avx(auVar54,auVar55);
  auVar55 = vpminsd_avx(auVar153,auVar63);
  uVar117 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar25._4_4_ = uVar117;
  auVar25._0_4_ = uVar117;
  auVar25._8_4_ = uVar117;
  auVar25._12_4_ = uVar117;
  auVar55 = vmaxps_avx512vl(auVar55,auVar25);
  auVar54 = vmaxps_avx(auVar54,auVar55);
  auVar26._8_4_ = 0x3f7ffffa;
  auVar26._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar26._12_4_ = 0x3f7ffffa;
  local_3e0 = vmulps_avx512vl(auVar54,auVar26);
  auVar54 = vpmaxsd_avx(auVar178,auVar133);
  auVar55 = vpmaxsd_avx(auVar165,auVar66);
  auVar54 = vminps_avx(auVar54,auVar55);
  auVar55 = vpmaxsd_avx(auVar153,auVar63);
  uVar117 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar75._4_4_ = uVar117;
  auVar75._0_4_ = uVar117;
  auVar75._8_4_ = uVar117;
  auVar75._12_4_ = uVar117;
  auVar55 = vminps_avx512vl(auVar55,auVar75);
  auVar54 = vminps_avx(auVar54,auVar55);
  auVar57._8_4_ = 0x3f800003;
  auVar57._0_8_ = 0x3f8000033f800003;
  auVar57._12_4_ = 0x3f800003;
  auVar54 = vmulps_avx512vl(auVar54,auVar57);
  auVar55 = vpbroadcastd_avx512vl();
  uVar22 = vcmpps_avx512vl(local_3e0,auVar54,2);
  uVar53 = vpcmpgtd_avx512vl(auVar55,_DAT_01ff0cf0);
  uVar53 = ((byte)uVar22 & 0xf) & uVar53;
  if ((char)uVar53 == '\0') {
    return;
  }
  local_240 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar54 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
  auVar295 = ZEXT1664(auVar54);
LAB_01c5e1ce:
  lVar49 = 0;
  for (uVar46 = uVar53; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000) {
    lVar49 = lVar49 + 1;
  }
  uVar52 = *(uint *)(prim + 2);
  pGVar8 = (context->scene->geometries).items[uVar52].ptr;
  fVar116 = (pGVar8->time_range).lower;
  fVar234 = pGVar8->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar116) / ((pGVar8->time_range).upper - fVar116));
  auVar54 = vroundss_avx(ZEXT416((uint)fVar234),ZEXT416((uint)fVar234),9);
  uVar6 = *(uint *)(prim + lVar49 * 4 + 6);
  auVar55 = vaddss_avx512f(ZEXT416((uint)pGVar8->fnumTimeSegments),SUB6416(ZEXT464(0xbf800000),0));
  auVar54 = vminss_avx(auVar54,auVar55);
  auVar57 = vmaxss_avx512f(auVar295._0_16_,auVar54);
  uVar46 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)uVar6 *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar48 = (long)(int)auVar57._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + lVar48);
  lVar11 = *(long *)(_Var9 + 0x10 + lVar48);
  auVar54 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar46);
  lVar49 = uVar46 + 1;
  auVar55 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar49);
  lVar1 = uVar46 + 2;
  auVar56 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  lVar2 = uVar46 + 3;
  auVar65 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
  lVar11 = *(long *)(lVar10 + lVar48);
  lVar12 = *(long *)(lVar10 + 0x10 + lVar48);
  auVar71 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar46);
  auVar68 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar49);
  auVar69 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  auVar70 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
  lVar11 = *(long *)(_Var9 + 0x38 + lVar48);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar48);
  auVar72 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar46);
  auVar73 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar49);
  auVar74 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  auVar24 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
  lVar11 = *(long *)(lVar10 + 0x38 + lVar48);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar48);
  auVar25 = *(undefined1 (*) [16])(lVar11 + uVar46 * lVar10);
  auVar26 = *(undefined1 (*) [16])(lVar11 + lVar49 * lVar10);
  auVar75 = *(undefined1 (*) [16])(lVar11 + lVar1 * lVar10);
  fVar234 = fVar234 - auVar57._0_4_;
  auVar77._0_16_ = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
  auVar57 = vmulps_avx512vl(auVar65,auVar77._0_16_);
  auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaab));
  auVar59 = vfmadd213ps_avx512vl(auVar58,auVar56,auVar57);
  auVar60 = vbroadcastss_avx512vl(ZEXT416(0x3f2aaaab));
  auVar59 = vfmadd231ps_avx512vl(auVar59,auVar55,auVar60);
  auVar59 = vfmadd231ps_avx512vl(auVar59,auVar54,auVar58);
  auVar61 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar57 = vfmadd231ps_avx512vl(auVar57,auVar56,auVar61);
  auVar57 = vfnmadd231ps_avx512vl(auVar57,auVar55,auVar77._0_16_);
  auVar57 = vfnmadd231ps_avx512vl(auVar57,auVar54,auVar61);
  auVar62 = vmulps_avx512vl(auVar70,auVar77._0_16_);
  auVar63 = vfmadd213ps_avx512vl(auVar58,auVar69,auVar62);
  auVar63 = vfmadd231ps_avx512vl(auVar63,auVar68,auVar60);
  auVar63 = vfmadd231ps_avx512vl(auVar63,auVar71,auVar58);
  auVar62 = vfmadd231ps_avx512vl(auVar62,auVar69,auVar61);
  auVar62 = vfnmadd231ps_avx512vl(auVar62,auVar68,auVar77._0_16_);
  auVar62 = vfnmadd231ps_avx512vl(auVar62,auVar71,auVar61);
  auVar64 = vmulps_avx512vl(auVar65,auVar58);
  auVar64 = vfmadd231ps_avx512vl(auVar64,auVar56,auVar60);
  auVar64 = vfmadd231ps_avx512vl(auVar64,auVar55,auVar58);
  auVar64 = vfmadd231ps_avx512vl(auVar64,auVar54,auVar77._0_16_);
  auVar65 = vmulps_avx512vl(auVar65,auVar61);
  auVar56 = vfmadd231ps_avx512vl(auVar65,auVar77._0_16_,auVar56);
  auVar55 = vfnmadd231ps_avx512vl(auVar56,auVar61,auVar55);
  auVar66 = vfnmadd231ps_avx512vl(auVar55,auVar77._0_16_,auVar54);
  auVar54 = vmulps_avx512vl(auVar70,auVar58);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar69,auVar60);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar68,auVar58);
  auVar67 = vfmadd231ps_avx512vl(auVar54,auVar71,auVar77._0_16_);
  auVar54 = vmulps_avx512vl(auVar70,auVar61);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar77._0_16_,auVar69);
  auVar54 = vfnmadd231ps_avx512vl(auVar54,auVar61,auVar68);
  auVar68 = vfnmadd231ps_avx512vl(auVar54,auVar77._0_16_,auVar71);
  auVar55 = vshufps_avx512vl(auVar57,auVar57,0xc9);
  auVar54 = vshufps_avx512vl(auVar63,auVar63,0xc9);
  auVar54 = vmulps_avx512vl(auVar57,auVar54);
  auVar54 = vfmsub231ps_avx512vl(auVar54,auVar55,auVar63);
  auVar56 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar54 = vshufps_avx(auVar62,auVar62,0xc9);
  auVar54 = vmulps_avx512vl(auVar57,auVar54);
  auVar54 = vfmsub231ps_fma(auVar54,auVar55,auVar62);
  auVar65 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar54 = vshufps_avx(auVar66,auVar66,0xc9);
  auVar55 = vshufps_avx(auVar67,auVar67,0xc9);
  auVar179._0_4_ = auVar66._0_4_ * auVar55._0_4_;
  auVar179._4_4_ = auVar66._4_4_ * auVar55._4_4_;
  auVar179._8_4_ = auVar66._8_4_ * auVar55._8_4_;
  auVar179._12_4_ = auVar66._12_4_ * auVar55._12_4_;
  auVar55 = vfmsub231ps_fma(auVar179,auVar54,auVar67);
  auVar71 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar55 = vshufps_avx(auVar68,auVar68,0xc9);
  auVar180._0_4_ = auVar66._0_4_ * auVar55._0_4_;
  auVar180._4_4_ = auVar66._4_4_ * auVar55._4_4_;
  auVar180._8_4_ = auVar66._8_4_ * auVar55._8_4_;
  auVar180._12_4_ = auVar66._12_4_ * auVar55._12_4_;
  auVar54 = vfmsub231ps_fma(auVar180,auVar54,auVar68);
  auVar68 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar54 = vdpps_avx(auVar56,auVar56,0x7f);
  auVar77._16_16_ = auVar95._16_16_;
  auVar91._4_28_ = auVar77._4_28_;
  auVar91._0_4_ = auVar54._0_4_;
  auVar55 = vrsqrt14ss_avx512f(auVar77._0_16_,auVar91._0_16_);
  auVar69 = vmulss_avx512f(auVar55,ZEXT416(0x3fc00000));
  auVar70 = vmulss_avx512f(auVar54,SUB6416(ZEXT464(0xbf000000),0));
  auVar70 = vmulss_avx512f(auVar70,auVar55);
  auVar55 = vmulss_avx512f(auVar70,ZEXT416((uint)(auVar55._0_4_ * auVar55._0_4_)));
  fVar116 = auVar69._0_4_ + auVar55._0_4_;
  auVar207._4_4_ = fVar116;
  auVar207._0_4_ = fVar116;
  auVar207._8_4_ = fVar116;
  auVar207._12_4_ = fVar116;
  auVar55 = vdpps_avx(auVar56,auVar65,0x7f);
  auVar69 = vmulps_avx512vl(auVar56,auVar207);
  auVar70 = vbroadcastss_avx512vl(auVar54);
  auVar65 = vmulps_avx512vl(auVar70,auVar65);
  fVar252 = auVar55._0_4_;
  auVar166._0_4_ = fVar252 * auVar56._0_4_;
  auVar166._4_4_ = fVar252 * auVar56._4_4_;
  auVar166._8_4_ = fVar252 * auVar56._8_4_;
  auVar166._12_4_ = fVar252 * auVar56._12_4_;
  auVar56 = vsubps_avx(auVar65,auVar166);
  auVar55 = vrcp14ss_avx512f(auVar77._0_16_,auVar91._0_16_);
  auVar54 = vfnmadd213ss_avx512f(auVar54,auVar55,ZEXT416(0x40000000));
  fVar247 = auVar55._0_4_ * auVar54._0_4_;
  auVar54 = vdpps_avx(auVar71,auVar71,0x7f);
  auVar94._16_16_ = auVar95._16_16_;
  auVar94._0_16_ = auVar77._0_16_;
  auVar93._4_28_ = auVar94._4_28_;
  auVar93._0_4_ = auVar54._0_4_;
  auVar55 = vrsqrt14ss_avx512f(auVar77._0_16_,auVar93._0_16_);
  auVar65 = vmulss_avx512f(auVar55,ZEXT416(0x3fc00000));
  fVar252 = auVar55._0_4_;
  fVar252 = auVar65._0_4_ + auVar54._0_4_ * -0.5 * fVar252 * fVar252 * fVar252;
  auVar208._0_4_ = auVar71._0_4_ * fVar252;
  auVar208._4_4_ = auVar71._4_4_ * fVar252;
  auVar208._8_4_ = auVar71._8_4_ * fVar252;
  auVar208._12_4_ = auVar71._12_4_ * fVar252;
  auVar55 = vdpps_avx(auVar71,auVar68,0x7f);
  auVar65 = vbroadcastss_avx512vl(auVar54);
  auVar65 = vmulps_avx512vl(auVar65,auVar68);
  fVar248 = auVar55._0_4_;
  auVar123._0_4_ = fVar248 * auVar71._0_4_;
  auVar123._4_4_ = fVar248 * auVar71._4_4_;
  auVar123._8_4_ = fVar248 * auVar71._8_4_;
  auVar123._12_4_ = fVar248 * auVar71._12_4_;
  auVar55 = vsubps_avx(auVar65,auVar123);
  auVar65 = vrcp14ss_avx512f(auVar77._0_16_,auVar93._0_16_);
  auVar54 = vfnmadd213ss_avx512f(auVar54,auVar65,ZEXT416(0x40000000));
  fVar248 = auVar65._0_4_ * auVar54._0_4_;
  auVar54 = vshufps_avx512vl(auVar59,auVar59,0xff);
  auVar65 = vmulps_avx512vl(auVar54,auVar69);
  auVar62 = vsubps_avx512vl(auVar59,auVar65);
  auVar71 = vshufps_avx512vl(auVar57,auVar57,0xff);
  auVar71 = vmulps_avx512vl(auVar71,auVar69);
  auVar154._0_4_ = auVar71._0_4_ + auVar54._0_4_ * fVar116 * fVar247 * auVar56._0_4_;
  auVar154._4_4_ = auVar71._4_4_ + auVar54._4_4_ * fVar116 * fVar247 * auVar56._4_4_;
  auVar154._8_4_ = auVar71._8_4_ + auVar54._8_4_ * fVar116 * fVar247 * auVar56._8_4_;
  auVar154._12_4_ = auVar71._12_4_ + auVar54._12_4_ * fVar116 * fVar247 * auVar56._12_4_;
  auVar56 = vsubps_avx512vl(auVar57,auVar154);
  auVar59 = vaddps_avx512vl(auVar59,auVar65);
  auVar65 = vaddps_avx512vl(auVar57,auVar154);
  auVar54 = vshufps_avx512vl(auVar64,auVar64,0xff);
  auVar71 = vmulps_avx512vl(auVar54,auVar208);
  auVar57 = vsubps_avx512vl(auVar64,auVar71);
  auVar68 = vshufps_avx512vl(auVar66,auVar66,0xff);
  auVar68 = vmulps_avx512vl(auVar68,auVar208);
  auVar209._0_4_ = auVar68._0_4_ + auVar54._0_4_ * fVar252 * auVar55._0_4_ * fVar248;
  auVar209._4_4_ = auVar68._4_4_ + auVar54._4_4_ * fVar252 * auVar55._4_4_ * fVar248;
  auVar209._8_4_ = auVar68._8_4_ + auVar54._8_4_ * fVar252 * auVar55._8_4_ * fVar248;
  auVar209._12_4_ = auVar68._12_4_ + auVar54._12_4_ * fVar252 * auVar55._12_4_ * fVar248;
  auVar54 = vsubps_avx(auVar66,auVar209);
  auVar63 = vaddps_avx512vl(auVar64,auVar71);
  auVar55 = vaddps_avx512vl(auVar66,auVar209);
  auVar118._8_4_ = 0x3eaaaaab;
  auVar118._0_8_ = 0x3eaaaaab3eaaaaab;
  auVar118._12_4_ = 0x3eaaaaab;
  auVar194._0_4_ = auVar62._0_4_ + auVar56._0_4_ * 0.33333334;
  auVar194._4_4_ = auVar62._4_4_ + auVar56._4_4_ * 0.33333334;
  auVar194._8_4_ = auVar62._8_4_ + auVar56._8_4_ * 0.33333334;
  auVar194._12_4_ = auVar62._12_4_ + auVar56._12_4_ * 0.33333334;
  auVar181._0_4_ = auVar54._0_4_ * 0.33333334;
  auVar181._4_4_ = auVar54._4_4_ * 0.33333334;
  auVar181._8_4_ = auVar54._8_4_ * 0.33333334;
  auVar181._12_4_ = auVar54._12_4_ * 0.33333334;
  auVar69 = vsubps_avx(auVar57,auVar181);
  local_4e0._4_4_ = auVar59._4_4_ + auVar65._4_4_ * 0.33333334;
  local_4e0._0_4_ = auVar59._0_4_ + auVar65._0_4_ * 0.33333334;
  fStack_4d8 = auVar59._8_4_ + auVar65._8_4_ * 0.33333334;
  fStack_4d4 = auVar59._12_4_ + auVar65._12_4_ * 0.33333334;
  auVar54 = vmulps_avx512vl(auVar55,auVar118);
  auVar70 = vsubps_avx(auVar63,auVar54);
  auVar54 = *(undefined1 (*) [16])(lVar11 + lVar10 * lVar2);
  auVar55 = vmulps_avx512vl(auVar24,auVar77._0_16_);
  auVar56 = vfmadd213ps_avx512vl(auVar58,auVar74,auVar55);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar73,auVar60);
  auVar64 = vfmadd231ps_avx512vl(auVar56,auVar72,auVar58);
  auVar55 = vfmadd231ps_avx512vl(auVar55,auVar74,auVar61);
  auVar55 = vfnmadd231ps_avx512vl(auVar55,auVar73,auVar77._0_16_);
  auVar66 = vfnmadd231ps_avx512vl(auVar55,auVar72,auVar61);
  auVar55 = vmulps_avx512vl(auVar54,auVar77._0_16_);
  auVar56 = vfmadd213ps_avx512vl(auVar58,auVar75,auVar55);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar26,auVar60);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar25,auVar58);
  auVar55 = vfmadd231ps_avx512vl(auVar55,auVar75,auVar61);
  auVar55 = vfnmadd231ps_avx512vl(auVar55,auVar26,auVar77._0_16_);
  auVar55 = vfnmadd231ps_avx512vl(auVar55,auVar25,auVar61);
  auVar65 = vmulps_avx512vl(auVar24,auVar58);
  auVar65 = vfmadd231ps_avx512vl(auVar65,auVar74,auVar60);
  auVar65 = vfmadd231ps_avx512vl(auVar65,auVar73,auVar58);
  auVar67 = vfmadd231ps_avx512vl(auVar65,auVar72,auVar77._0_16_);
  auVar65 = vmulps_avx512vl(auVar24,auVar61);
  auVar65 = vfmadd231ps_avx512vl(auVar65,auVar77._0_16_,auVar74);
  auVar65 = vfnmadd231ps_avx512vl(auVar65,auVar61,auVar73);
  auVar72 = vfnmadd231ps_avx512vl(auVar65,auVar77._0_16_,auVar72);
  auVar65 = vmulps_avx512vl(auVar54,auVar58);
  auVar65 = vfmadd231ps_avx512vl(auVar65,auVar75,auVar60);
  auVar65 = vfmadd231ps_avx512vl(auVar65,auVar26,auVar58);
  auVar71 = vfmadd231ps_avx512vl(auVar65,auVar25,auVar77._0_16_);
  auVar54 = vmulps_avx512vl(auVar54,auVar61);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar77._0_16_,auVar75);
  auVar54 = vfnmadd231ps_avx512vl(auVar54,auVar61,auVar26);
  auVar68 = vfnmadd231ps_avx512vl(auVar54,auVar77._0_16_,auVar25);
  auVar54 = vshufps_avx(auVar66,auVar66,0xc9);
  auVar65 = vshufps_avx512vl(auVar56,auVar56,0xc9);
  fVar248 = auVar66._0_4_;
  auVar261._0_4_ = fVar248 * auVar65._0_4_;
  fVar176 = auVar66._4_4_;
  auVar261._4_4_ = fVar176 * auVar65._4_4_;
  fVar191 = auVar66._8_4_;
  auVar261._8_4_ = fVar191 * auVar65._8_4_;
  fVar192 = auVar66._12_4_;
  auVar261._12_4_ = fVar192 * auVar65._12_4_;
  auVar56 = vfmsub231ps_avx512vl(auVar261,auVar54,auVar56);
  auVar56 = vshufps_avx(auVar56,auVar56,0xc9);
  auVar65 = vshufps_avx512vl(auVar55,auVar55,0xc9);
  auVar270._0_4_ = fVar248 * auVar65._0_4_;
  auVar270._4_4_ = fVar176 * auVar65._4_4_;
  auVar270._8_4_ = fVar191 * auVar65._8_4_;
  auVar270._12_4_ = fVar192 * auVar65._12_4_;
  auVar54 = vfmsub231ps_avx512vl(auVar270,auVar54,auVar55);
  auVar65 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar73 = vshufps_avx512vl(auVar72,auVar72,0xc9);
  auVar54 = vshufps_avx(auVar71,auVar71,0xc9);
  auVar54 = vmulps_avx512vl(auVar72,auVar54);
  auVar54 = vfmsub231ps_fma(auVar54,auVar73,auVar71);
  auVar71 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar55 = vshufps_avx(auVar68,auVar68,0xc9);
  auVar54 = vdpps_avx(auVar56,auVar56,0x7f);
  auVar55 = vmulps_avx512vl(auVar72,auVar55);
  auVar55 = vfmsub231ps_fma(auVar55,auVar73,auVar68);
  auVar68 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar79._16_16_ = auVar95._16_16_;
  auVar79._0_16_ = auVar77._0_16_;
  auVar78._4_28_ = auVar79._4_28_;
  auVar78._0_4_ = auVar54._0_4_;
  auVar55 = vrsqrt14ss_avx512f(auVar77._0_16_,auVar78._0_16_);
  auVar73 = vmulss_avx512f(auVar55,ZEXT416(0x3fc00000));
  auVar74 = vmulss_avx512f(auVar54,ZEXT416(0xbf000000));
  auVar74 = vmulss_avx512f(auVar74,auVar55);
  auVar55 = vmulss_avx512f(auVar74,ZEXT416((uint)(auVar55._0_4_ * auVar55._0_4_)));
  auVar55 = vaddss_avx512f(auVar73,auVar55);
  auVar285._0_4_ = auVar55._0_4_;
  auVar285._4_4_ = auVar285._0_4_;
  auVar285._8_4_ = auVar285._0_4_;
  auVar285._12_4_ = auVar285._0_4_;
  auVar73 = vmulps_avx512vl(auVar56,auVar285);
  auVar55 = vdpps_avx(auVar56,auVar65,0x7f);
  auVar74 = vbroadcastss_avx512vl(auVar54);
  auVar65 = vmulps_avx512vl(auVar74,auVar65);
  fVar116 = auVar55._0_4_;
  auVar182._0_4_ = auVar56._0_4_ * fVar116;
  auVar182._4_4_ = auVar56._4_4_ * fVar116;
  auVar182._8_4_ = auVar56._8_4_ * fVar116;
  auVar182._12_4_ = auVar56._12_4_ * fVar116;
  auVar56 = vsubps_avx(auVar65,auVar182);
  auVar55 = vrcp14ss_avx512f(auVar77._0_16_,auVar78._0_16_);
  auVar54 = vfnmadd213ss_avx512f(auVar54,auVar55,ZEXT416(0x40000000));
  fVar252 = auVar55._0_4_ * auVar54._0_4_;
  auVar54 = vdpps_avx(auVar71,auVar71,0x7f);
  auVar81._16_16_ = auVar95._16_16_;
  auVar81._0_16_ = auVar77._0_16_;
  auVar80._4_28_ = auVar81._4_28_;
  auVar80._0_4_ = auVar54._0_4_;
  auVar55 = vrsqrt14ss_avx512f(auVar77._0_16_,auVar80._0_16_);
  auVar65 = vmulss_avx512f(auVar55,ZEXT416(0x3fc00000));
  auVar292 = ZEXT464(0x3f800000);
  auVar74 = vmulss_avx512f(auVar54,ZEXT416(0xbf000000));
  fVar116 = auVar55._0_4_;
  fVar116 = auVar65._0_4_ + auVar74._0_4_ * fVar116 * fVar116 * fVar116;
  auVar278._0_4_ = auVar71._0_4_ * fVar116;
  auVar278._4_4_ = auVar71._4_4_ * fVar116;
  auVar278._8_4_ = auVar71._8_4_ * fVar116;
  auVar278._12_4_ = auVar71._12_4_ * fVar116;
  auVar55 = vdpps_avx(auVar71,auVar68,0x7f);
  auVar65 = vbroadcastss_avx512vl(auVar54);
  auVar65 = vmulps_avx512vl(auVar65,auVar68);
  fVar247 = auVar55._0_4_;
  auVar235._0_4_ = fVar247 * auVar71._0_4_;
  auVar235._4_4_ = fVar247 * auVar71._4_4_;
  auVar235._8_4_ = fVar247 * auVar71._8_4_;
  auVar235._12_4_ = fVar247 * auVar71._12_4_;
  auVar55 = vsubps_avx(auVar65,auVar235);
  auVar65 = vrcp14ss_avx512f(auVar77._0_16_,auVar80._0_16_);
  auVar54 = vfnmadd213ss_avx512f(auVar54,auVar65,ZEXT416(0x40000000));
  fVar247 = auVar54._0_4_ * auVar65._0_4_;
  auVar65 = vshufps_avx512vl(auVar64,auVar64,0xff);
  auVar71 = vmulps_avx512vl(auVar65,auVar73);
  auVar68 = vsubps_avx512vl(auVar64,auVar71);
  auVar54 = vshufps_avx(auVar66,auVar66,0xff);
  auVar54 = vmulps_avx512vl(auVar54,auVar73);
  auVar167._0_4_ = auVar54._0_4_ + auVar65._0_4_ * auVar285._0_4_ * fVar252 * auVar56._0_4_;
  auVar167._4_4_ = auVar54._4_4_ + auVar65._4_4_ * auVar285._0_4_ * fVar252 * auVar56._4_4_;
  auVar167._8_4_ = auVar54._8_4_ + auVar65._8_4_ * auVar285._0_4_ * fVar252 * auVar56._8_4_;
  auVar167._12_4_ = auVar54._12_4_ + auVar65._12_4_ * auVar285._0_4_ * fVar252 * auVar56._12_4_;
  auVar54 = vsubps_avx(auVar66,auVar167);
  auVar56 = vaddps_avx512vl(auVar64,auVar71);
  auVar65 = vshufps_avx512vl(auVar67,auVar67,0xff);
  auVar271._0_4_ = auVar65._0_4_ * auVar278._0_4_;
  auVar271._4_4_ = auVar65._4_4_ * auVar278._4_4_;
  auVar271._8_4_ = auVar65._8_4_ * auVar278._8_4_;
  auVar271._12_4_ = auVar65._12_4_ * auVar278._12_4_;
  auVar71 = vsubps_avx512vl(auVar67,auVar271);
  auVar73 = vshufps_avx512vl(auVar72,auVar72,0xff);
  auVar73 = vmulps_avx512vl(auVar73,auVar278);
  auVar183._0_4_ = auVar73._0_4_ + auVar65._0_4_ * fVar116 * auVar55._0_4_ * fVar247;
  auVar183._4_4_ = auVar73._4_4_ + auVar65._4_4_ * fVar116 * auVar55._4_4_ * fVar247;
  auVar183._8_4_ = auVar73._8_4_ + auVar65._8_4_ * fVar116 * auVar55._8_4_ * fVar247;
  auVar183._12_4_ = auVar73._12_4_ + auVar65._12_4_ * fVar116 * auVar55._12_4_ * fVar247;
  auVar55 = vsubps_avx512vl(auVar72,auVar183);
  auVar65 = vaddps_avx512vl(auVar67,auVar271);
  auVar72 = vaddps_avx512vl(auVar72,auVar183);
  auVar236._0_4_ = auVar68._0_4_ + auVar54._0_4_ * 0.33333334;
  auVar236._4_4_ = auVar68._4_4_ + auVar54._4_4_ * 0.33333334;
  auVar236._8_4_ = auVar68._8_4_ + auVar54._8_4_ * 0.33333334;
  auVar236._12_4_ = auVar68._12_4_ + auVar54._12_4_ * 0.33333334;
  auVar227._0_4_ = auVar55._0_4_ * 0.33333334;
  auVar227._4_4_ = auVar55._4_4_ * 0.33333334;
  auVar227._8_4_ = auVar55._8_4_ * 0.33333334;
  auVar227._12_4_ = auVar55._12_4_ * 0.33333334;
  auVar54 = vsubps_avx(auVar71,auVar227);
  auVar168._0_4_ = auVar56._0_4_ + (fVar248 + auVar167._0_4_) * 0.33333334;
  auVar168._4_4_ = auVar56._4_4_ + (fVar176 + auVar167._4_4_) * 0.33333334;
  auVar168._8_4_ = auVar56._8_4_ + (fVar191 + auVar167._8_4_) * 0.33333334;
  auVar168._12_4_ = auVar56._12_4_ + (fVar192 + auVar167._12_4_) * 0.33333334;
  auVar184._0_4_ = auVar72._0_4_ * 0.33333334;
  auVar184._4_4_ = auVar72._4_4_ * 0.33333334;
  auVar184._8_4_ = auVar72._8_4_ * 0.33333334;
  auVar184._12_4_ = auVar72._12_4_ * 0.33333334;
  auVar55 = vsubps_avx(auVar65,auVar184);
  auVar279._4_4_ = fVar234;
  auVar279._0_4_ = fVar234;
  auVar279._8_4_ = fVar234;
  auVar279._12_4_ = fVar234;
  auVar72 = vsubss_avx512f(ZEXT416(0x3f800000),ZEXT416((uint)fVar234));
  auVar119._0_4_ = auVar72._0_4_;
  auVar119._4_4_ = auVar119._0_4_;
  auVar119._8_4_ = auVar119._0_4_;
  auVar119._12_4_ = auVar119._0_4_;
  auVar68 = vmulps_avx512vl(auVar279,auVar68);
  auVar72 = vmulps_avx512vl(auVar279,auVar236);
  auVar54 = vmulps_avx512vl(auVar279,auVar54);
  auVar286._0_4_ = fVar234 * auVar71._0_4_;
  auVar286._4_4_ = fVar234 * auVar71._4_4_;
  auVar286._8_4_ = fVar234 * auVar71._8_4_;
  auVar286._12_4_ = fVar234 * auVar71._12_4_;
  local_320 = vfmadd231ps_avx512vl(auVar68,auVar119,auVar62);
  local_330 = vfmadd231ps_avx512vl(auVar72,auVar119,auVar194);
  local_340 = vfmadd231ps_avx512vl(auVar54,auVar119,auVar69);
  local_350 = vfmadd231ps_fma(auVar286,auVar119,auVar57);
  auVar54 = vmulps_avx512vl(auVar279,auVar56);
  auVar56 = vmulps_avx512vl(auVar279,auVar168);
  auVar55 = vmulps_avx512vl(auVar279,auVar55);
  auVar272._0_4_ = fVar234 * auVar65._0_4_;
  auVar272._4_4_ = fVar234 * auVar65._4_4_;
  auVar272._8_4_ = fVar234 * auVar65._8_4_;
  auVar272._12_4_ = fVar234 * auVar65._12_4_;
  _local_360 = vfmadd231ps_avx512vl(auVar54,auVar119,auVar59);
  _local_370 = vfmadd231ps_avx512vl(auVar56,auVar119,_local_4e0);
  _local_380 = vfmadd231ps_avx512vl(auVar55,auVar119,auVar70);
  _local_390 = vfmadd231ps_fma(auVar272,auVar119,auVar63);
  auVar54 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar54 = vinsertps_avx(auVar54,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar116 = *(float *)(ray + k * 4 + 0x60);
  local_2a0 = vsubps_avx512vl(local_320,auVar54);
  uVar117 = local_2a0._0_4_;
  auVar124._4_4_ = uVar117;
  auVar124._0_4_ = uVar117;
  auVar124._8_4_ = uVar117;
  auVar124._12_4_ = uVar117;
  auVar55 = vshufps_avx(local_2a0,local_2a0,0x55);
  auVar56 = vshufps_avx(local_2a0,local_2a0,0xaa);
  aVar3 = pre->ray_space[k].vx.field_0;
  aVar4 = pre->ray_space[k].vy.field_0;
  fVar252 = pre->ray_space[k].vz.field_0.m128[0];
  fVar234 = pre->ray_space[k].vz.field_0.m128[1];
  fVar247 = pre->ray_space[k].vz.field_0.m128[2];
  fVar248 = pre->ray_space[k].vz.field_0.m128[3];
  auVar120._0_4_ = fVar252 * auVar56._0_4_;
  auVar120._4_4_ = fVar234 * auVar56._4_4_;
  auVar120._8_4_ = fVar247 * auVar56._8_4_;
  auVar120._12_4_ = fVar248 * auVar56._12_4_;
  auVar55 = vfmadd231ps_fma(auVar120,(undefined1  [16])aVar4,auVar55);
  auVar69 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar3,auVar124);
  local_2b0 = vsubps_avx512vl(local_330,auVar54);
  uVar117 = local_2b0._0_4_;
  auVar134._4_4_ = uVar117;
  auVar134._0_4_ = uVar117;
  auVar134._8_4_ = uVar117;
  auVar134._12_4_ = uVar117;
  auVar55 = vshufps_avx(local_2b0,local_2b0,0x55);
  auVar56 = vshufps_avx(local_2b0,local_2b0,0xaa);
  auVar125._0_4_ = fVar252 * auVar56._0_4_;
  auVar125._4_4_ = fVar234 * auVar56._4_4_;
  auVar125._8_4_ = fVar247 * auVar56._8_4_;
  auVar125._12_4_ = fVar248 * auVar56._12_4_;
  auVar55 = vfmadd231ps_fma(auVar125,(undefined1  [16])aVar4,auVar55);
  auVar70 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar3,auVar134);
  local_2c0 = vsubps_avx512vl(local_340,auVar54);
  uVar117 = local_2c0._0_4_;
  auVar185._4_4_ = uVar117;
  auVar185._0_4_ = uVar117;
  auVar185._8_4_ = uVar117;
  auVar185._12_4_ = uVar117;
  auVar55 = vshufps_avx(local_2c0,local_2c0,0x55);
  auVar56 = vshufps_avx(local_2c0,local_2c0,0xaa);
  auVar135._0_4_ = fVar252 * auVar56._0_4_;
  auVar135._4_4_ = fVar234 * auVar56._4_4_;
  auVar135._8_4_ = fVar247 * auVar56._8_4_;
  auVar135._12_4_ = fVar248 * auVar56._12_4_;
  auVar55 = vfmadd231ps_fma(auVar135,(undefined1  [16])aVar4,auVar55);
  auVar72 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar3,auVar185);
  local_2d0 = vsubps_avx(local_350,auVar54);
  uVar117 = local_2d0._0_4_;
  auVar210._4_4_ = uVar117;
  auVar210._0_4_ = uVar117;
  auVar210._8_4_ = uVar117;
  auVar210._12_4_ = uVar117;
  auVar55 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar56 = vshufps_avx(local_2d0,local_2d0,0xaa);
  auVar186._0_4_ = fVar252 * auVar56._0_4_;
  auVar186._4_4_ = fVar234 * auVar56._4_4_;
  auVar186._8_4_ = fVar247 * auVar56._8_4_;
  auVar186._12_4_ = fVar248 * auVar56._12_4_;
  auVar55 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar4,auVar55);
  auVar73 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar3,auVar210);
  local_2e0 = vsubps_avx512vl(_local_360,auVar54);
  uVar117 = local_2e0._0_4_;
  auVar211._4_4_ = uVar117;
  auVar211._0_4_ = uVar117;
  auVar211._8_4_ = uVar117;
  auVar211._12_4_ = uVar117;
  auVar55 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar56 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar237._0_4_ = auVar56._0_4_ * fVar252;
  auVar237._4_4_ = auVar56._4_4_ * fVar234;
  auVar237._8_4_ = auVar56._8_4_ * fVar247;
  auVar237._12_4_ = auVar56._12_4_ * fVar248;
  auVar55 = vfmadd231ps_fma(auVar237,(undefined1  [16])aVar4,auVar55);
  auVar74 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar3,auVar211);
  local_2f0 = vsubps_avx512vl(_local_370,auVar54);
  uVar117 = local_2f0._0_4_;
  auVar212._4_4_ = uVar117;
  auVar212._0_4_ = uVar117;
  auVar212._8_4_ = uVar117;
  auVar212._12_4_ = uVar117;
  auVar55 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar56 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar254._0_4_ = auVar56._0_4_ * fVar252;
  auVar254._4_4_ = auVar56._4_4_ * fVar234;
  auVar254._8_4_ = auVar56._8_4_ * fVar247;
  auVar254._12_4_ = auVar56._12_4_ * fVar248;
  auVar55 = vfmadd231ps_fma(auVar254,(undefined1  [16])aVar4,auVar55);
  auVar24 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar3,auVar212);
  local_300 = vsubps_avx512vl(_local_380,auVar54);
  uVar117 = local_300._0_4_;
  auVar213._4_4_ = uVar117;
  auVar213._0_4_ = uVar117;
  auVar213._8_4_ = uVar117;
  auVar213._12_4_ = uVar117;
  auVar55 = vshufps_avx(local_300,local_300,0x55);
  auVar56 = vshufps_avx(local_300,local_300,0xaa);
  auVar262._0_4_ = auVar56._0_4_ * fVar252;
  auVar262._4_4_ = auVar56._4_4_ * fVar234;
  auVar262._8_4_ = auVar56._8_4_ * fVar247;
  auVar262._12_4_ = auVar56._12_4_ * fVar248;
  auVar55 = vfmadd231ps_fma(auVar262,(undefined1  [16])aVar4,auVar55);
  auVar25 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar3,auVar213);
  local_310 = vsubps_avx(_local_390,auVar54);
  uVar117 = local_310._0_4_;
  auVar155._4_4_ = uVar117;
  auVar155._0_4_ = uVar117;
  auVar155._8_4_ = uVar117;
  auVar155._12_4_ = uVar117;
  auVar54 = vshufps_avx(local_310,local_310,0x55);
  auVar55 = vshufps_avx(local_310,local_310,0xaa);
  auVar195._0_4_ = auVar55._0_4_ * fVar252;
  auVar195._4_4_ = auVar55._4_4_ * fVar234;
  auVar195._8_4_ = auVar55._8_4_ * fVar247;
  auVar195._12_4_ = auVar55._12_4_ * fVar248;
  auVar54 = vfmadd231ps_fma(auVar195,(undefined1  [16])aVar4,auVar54);
  auVar26 = vfmadd231ps_fma(auVar54,(undefined1  [16])aVar3,auVar155);
  auVar56 = vmovlhps_avx(auVar69,auVar74);
  auVar65 = vmovlhps_avx(auVar70,auVar24);
  auVar71 = vmovlhps_avx(auVar72,auVar25);
  _local_460 = vmovlhps_avx512f(auVar73,auVar26);
  auVar55 = vminps_avx(auVar56,auVar65);
  auVar54 = vmaxps_avx(auVar56,auVar65);
  auVar68 = vminps_avx512vl(auVar71,_local_460);
  auVar55 = vminps_avx(auVar55,auVar68);
  auVar68 = vmaxps_avx512vl(auVar71,_local_460);
  auVar54 = vmaxps_avx(auVar54,auVar68);
  auVar68 = vshufpd_avx(auVar55,auVar55,3);
  auVar55 = vminps_avx(auVar55,auVar68);
  auVar68 = vshufpd_avx(auVar54,auVar54,3);
  auVar54 = vmaxps_avx(auVar54,auVar68);
  auVar55 = vandps_avx512vl(auVar55,auVar290._0_16_);
  auVar54 = vandps_avx512vl(auVar54,auVar290._0_16_);
  auVar54 = vmaxps_avx(auVar55,auVar54);
  auVar55 = vmovshdup_avx(auVar54);
  auVar54 = vmaxss_avx(auVar55,auVar54);
  fVar252 = auVar54._0_4_ * 9.536743e-07;
  local_420 = vmovddup_avx512vl(auVar69);
  local_430 = vmovddup_avx512vl(auVar70);
  local_440 = vmovddup_avx512vl(auVar72);
  local_450 = vmovddup_avx512vl(auVar73);
  local_470 = ZEXT416((uint)fVar252);
  auVar121._4_4_ = fVar252;
  auVar121._0_4_ = fVar252;
  auVar121._8_4_ = fVar252;
  auVar121._12_4_ = fVar252;
  local_1c0._16_4_ = fVar252;
  local_1c0._0_16_ = auVar121;
  local_1c0._20_4_ = fVar252;
  local_1c0._24_4_ = fVar252;
  local_1c0._28_4_ = fVar252;
  auVar27._8_4_ = 0x80000000;
  auVar27._0_8_ = 0x8000000080000000;
  auVar27._12_4_ = 0x80000000;
  auVar54 = vxorps_avx512vl(auVar121,auVar27);
  local_1e0 = auVar54._0_4_;
  uStack_1dc = local_1e0;
  uStack_1d8 = local_1e0;
  uStack_1d4 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1cc = local_1e0;
  uStack_1c8 = local_1e0;
  uStack_1c4 = local_1e0;
  uVar46 = 0;
  local_270 = vsubps_avx(auVar65,auVar56);
  local_280 = vsubps_avx(auVar71,auVar65);
  local_290 = vsubps_avx512vl(_local_460,auVar71);
  local_3a0 = vsubps_avx512vl(_local_360,local_320);
  local_3b0 = vsubps_avx512vl(_local_370,local_330);
  local_3c0 = vsubps_avx512vl(_local_380,local_340);
  _local_3d0 = vsubps_avx(_local_390,local_350);
  local_200 = vpbroadcastd_avx512vl();
  local_220 = vpbroadcastd_avx512vl();
  auVar54 = ZEXT816(0x3f80000000000000);
  auVar288 = ZEXT1664(auVar54);
  do {
    auVar293 = ZEXT1664(local_450);
    auVar57 = auVar288._0_16_;
    auVar55 = vshufps_avx(auVar57,auVar57,0x50);
    auVar273._8_4_ = 0x3f800000;
    auVar273._0_8_ = &DAT_3f8000003f800000;
    auVar273._12_4_ = 0x3f800000;
    auVar276._16_4_ = 0x3f800000;
    auVar276._0_16_ = auVar273;
    auVar276._20_4_ = 0x3f800000;
    auVar276._24_4_ = 0x3f800000;
    auVar276._28_4_ = 0x3f800000;
    auVar68 = vsubps_avx(auVar273,auVar55);
    fVar252 = auVar55._0_4_;
    fVar176 = auVar74._0_4_;
    auVar142._0_4_ = fVar176 * fVar252;
    fVar234 = auVar55._4_4_;
    fVar191 = auVar74._4_4_;
    auVar142._4_4_ = fVar191 * fVar234;
    fVar247 = auVar55._8_4_;
    auVar142._8_4_ = fVar176 * fVar247;
    fVar248 = auVar55._12_4_;
    auVar142._12_4_ = fVar191 * fVar248;
    fVar233 = auVar24._0_4_;
    auVar156._0_4_ = fVar233 * fVar252;
    fVar246 = auVar24._4_4_;
    auVar156._4_4_ = fVar246 * fVar234;
    auVar156._8_4_ = fVar233 * fVar247;
    auVar156._12_4_ = fVar246 * fVar248;
    fVar253 = auVar25._0_4_;
    auVar169._0_4_ = fVar253 * fVar252;
    fVar260 = auVar25._4_4_;
    auVar169._4_4_ = fVar260 * fVar234;
    auVar169._8_4_ = fVar253 * fVar247;
    auVar169._12_4_ = fVar260 * fVar248;
    fVar192 = auVar26._0_4_;
    auVar126._0_4_ = fVar192 * fVar252;
    fVar205 = auVar26._4_4_;
    auVar126._4_4_ = fVar205 * fVar234;
    auVar126._8_4_ = fVar192 * fVar247;
    auVar126._12_4_ = fVar205 * fVar248;
    auVar69 = vfmadd231ps_avx512vl(auVar142,auVar68,local_420);
    auVar70 = vfmadd231ps_avx512vl(auVar156,auVar68,local_430);
    auVar72 = vfmadd231ps_avx512vl(auVar169,auVar68,local_440);
    auVar68 = vfmadd231ps_avx512vl(auVar126,local_450,auVar68);
    auVar55 = vmovshdup_avx(auVar54);
    fVar234 = auVar54._0_4_;
    fVar252 = (auVar55._0_4_ - fVar234) * 0.04761905;
    auVar149._4_4_ = fVar234;
    auVar149._0_4_ = fVar234;
    auVar149._8_4_ = fVar234;
    auVar149._12_4_ = fVar234;
    auVar149._16_4_ = fVar234;
    auVar149._20_4_ = fVar234;
    auVar149._24_4_ = fVar234;
    auVar149._28_4_ = fVar234;
    auVar88._0_8_ = auVar55._0_8_;
    auVar88._8_8_ = auVar88._0_8_;
    auVar88._16_8_ = auVar88._0_8_;
    auVar88._24_8_ = auVar88._0_8_;
    auVar95 = vsubps_avx(auVar88,auVar149);
    uVar117 = auVar69._0_4_;
    auVar97._4_4_ = uVar117;
    auVar97._0_4_ = uVar117;
    auVar97._8_4_ = uVar117;
    auVar97._12_4_ = uVar117;
    auVar97._16_4_ = uVar117;
    auVar97._20_4_ = uVar117;
    auVar97._24_4_ = uVar117;
    auVar97._28_4_ = uVar117;
    auVar230._8_4_ = 1;
    auVar230._0_8_ = 0x100000001;
    auVar230._12_4_ = 1;
    auVar230._16_4_ = 1;
    auVar230._20_4_ = 1;
    auVar230._24_4_ = 1;
    auVar230._28_4_ = 1;
    auVar93 = ZEXT1632(auVar69);
    auVar91 = vpermps_avx2(auVar230,auVar93);
    auVar77 = vbroadcastss_avx512vl(auVar70);
    auVar94 = ZEXT1632(auVar70);
    auVar78 = vpermps_avx512vl(auVar230,auVar94);
    auVar79 = vbroadcastss_avx512vl(auVar72);
    auVar92 = ZEXT1632(auVar72);
    auVar80 = vpermps_avx512vl(auVar230,auVar92);
    auVar81 = vbroadcastss_avx512vl(auVar68);
    auVar90 = ZEXT1632(auVar68);
    auVar82 = vpermps_avx512vl(auVar230,auVar90);
    auVar231._4_4_ = fVar252;
    auVar231._0_4_ = fVar252;
    auVar231._8_4_ = fVar252;
    auVar231._12_4_ = fVar252;
    auVar231._16_4_ = fVar252;
    auVar231._20_4_ = fVar252;
    auVar231._24_4_ = fVar252;
    auVar231._28_4_ = fVar252;
    auVar89._8_4_ = 2;
    auVar89._0_8_ = 0x200000002;
    auVar89._12_4_ = 2;
    auVar89._16_4_ = 2;
    auVar89._20_4_ = 2;
    auVar89._24_4_ = 2;
    auVar89._28_4_ = 2;
    auVar83 = vpermps_avx512vl(auVar89,auVar93);
    auVar84 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar85 = vpermps_avx512vl(auVar84,auVar93);
    auVar93 = vpermps_avx2(auVar89,auVar94);
    auVar86 = vpermps_avx512vl(auVar84,auVar94);
    auVar94 = vpermps_avx2(auVar89,auVar92);
    auVar87 = vpermps_avx512vl(auVar84,auVar92);
    auVar88 = vpermps_avx512vl(auVar89,auVar90);
    auVar89 = vpermps_avx512vl(auVar84,auVar90);
    auVar55 = vfmadd132ps_fma(auVar95,auVar149,_DAT_02020f20);
    auVar95 = vsubps_avx(auVar276,ZEXT1632(auVar55));
    auVar84 = vmulps_avx512vl(auVar77,ZEXT1632(auVar55));
    auVar92 = ZEXT1632(auVar55);
    auVar90 = vmulps_avx512vl(auVar78,auVar92);
    auVar68 = vfmadd231ps_fma(auVar84,auVar95,auVar97);
    auVar69 = vfmadd231ps_fma(auVar90,auVar95,auVar91);
    auVar84 = vmulps_avx512vl(auVar79,auVar92);
    auVar90 = vmulps_avx512vl(auVar80,auVar92);
    auVar77 = vfmadd231ps_avx512vl(auVar84,auVar95,auVar77);
    auVar78 = vfmadd231ps_avx512vl(auVar90,auVar95,auVar78);
    auVar84 = vmulps_avx512vl(auVar81,auVar92);
    auVar97 = ZEXT1632(auVar55);
    auVar82 = vmulps_avx512vl(auVar82,auVar97);
    auVar79 = vfmadd231ps_avx512vl(auVar84,auVar95,auVar79);
    auVar80 = vfmadd231ps_avx512vl(auVar82,auVar95,auVar80);
    fVar247 = auVar55._0_4_;
    fVar248 = auVar55._4_4_;
    auVar82._4_4_ = fVar248 * auVar77._4_4_;
    auVar82._0_4_ = fVar247 * auVar77._0_4_;
    fVar249 = auVar55._8_4_;
    auVar82._8_4_ = fVar249 * auVar77._8_4_;
    fVar250 = auVar55._12_4_;
    auVar82._12_4_ = fVar250 * auVar77._12_4_;
    auVar82._16_4_ = auVar77._16_4_ * 0.0;
    auVar82._20_4_ = auVar77._20_4_ * 0.0;
    auVar82._24_4_ = auVar77._24_4_ * 0.0;
    auVar82._28_4_ = fVar234;
    auVar84._4_4_ = fVar248 * auVar78._4_4_;
    auVar84._0_4_ = fVar247 * auVar78._0_4_;
    auVar84._8_4_ = fVar249 * auVar78._8_4_;
    auVar84._12_4_ = fVar250 * auVar78._12_4_;
    auVar84._16_4_ = auVar78._16_4_ * 0.0;
    auVar84._20_4_ = auVar78._20_4_ * 0.0;
    auVar84._24_4_ = auVar78._24_4_ * 0.0;
    auVar84._28_4_ = auVar91._28_4_;
    auVar68 = vfmadd231ps_fma(auVar82,auVar95,ZEXT1632(auVar68));
    auVar69 = vfmadd231ps_fma(auVar84,auVar95,ZEXT1632(auVar69));
    auVar96._0_4_ = fVar247 * auVar79._0_4_;
    auVar96._4_4_ = fVar248 * auVar79._4_4_;
    auVar96._8_4_ = fVar249 * auVar79._8_4_;
    auVar96._12_4_ = fVar250 * auVar79._12_4_;
    auVar96._16_4_ = auVar79._16_4_ * 0.0;
    auVar96._20_4_ = auVar79._20_4_ * 0.0;
    auVar96._24_4_ = auVar79._24_4_ * 0.0;
    auVar96._28_4_ = 0;
    auVar90._4_4_ = fVar248 * auVar80._4_4_;
    auVar90._0_4_ = fVar247 * auVar80._0_4_;
    auVar90._8_4_ = fVar249 * auVar80._8_4_;
    auVar90._12_4_ = fVar250 * auVar80._12_4_;
    auVar90._16_4_ = auVar80._16_4_ * 0.0;
    auVar90._20_4_ = auVar80._20_4_ * 0.0;
    auVar90._24_4_ = auVar80._24_4_ * 0.0;
    auVar90._28_4_ = auVar79._28_4_;
    auVar70 = vfmadd231ps_fma(auVar96,auVar95,auVar77);
    auVar72 = vfmadd231ps_fma(auVar90,auVar95,auVar78);
    auVar92._28_4_ = auVar78._28_4_;
    auVar92._0_28_ =
         ZEXT1628(CONCAT412(fVar250 * auVar72._12_4_,
                            CONCAT48(fVar249 * auVar72._8_4_,
                                     CONCAT44(fVar248 * auVar72._4_4_,fVar247 * auVar72._0_4_))));
    auVar73 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar250 * auVar70._12_4_,
                                                 CONCAT48(fVar249 * auVar70._8_4_,
                                                          CONCAT44(fVar248 * auVar70._4_4_,
                                                                   fVar247 * auVar70._0_4_)))),
                              auVar95,ZEXT1632(auVar68));
    auVar75 = vfmadd231ps_fma(auVar92,auVar95,ZEXT1632(auVar69));
    auVar91 = vsubps_avx(ZEXT1632(auVar70),ZEXT1632(auVar68));
    auVar77 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar69));
    auVar78 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar91 = vmulps_avx512vl(auVar91,auVar78);
    auVar77 = vmulps_avx512vl(auVar77,auVar78);
    auVar160._0_4_ = fVar252 * auVar91._0_4_;
    auVar160._4_4_ = fVar252 * auVar91._4_4_;
    auVar160._8_4_ = fVar252 * auVar91._8_4_;
    auVar160._12_4_ = fVar252 * auVar91._12_4_;
    auVar160._16_4_ = fVar252 * auVar91._16_4_;
    auVar160._20_4_ = fVar252 * auVar91._20_4_;
    auVar160._24_4_ = fVar252 * auVar91._24_4_;
    auVar160._28_4_ = 0;
    auVar91 = vmulps_avx512vl(auVar231,auVar77);
    auVar70 = vxorps_avx512vl(auVar81._0_16_,auVar81._0_16_);
    auVar77 = vpermt2ps_avx512vl(ZEXT1632(auVar73),_DAT_0205fd20,ZEXT1632(auVar70));
    auVar79 = vpermt2ps_avx512vl(ZEXT1632(auVar75),_DAT_0205fd20,ZEXT1632(auVar70));
    auVar132._0_4_ = auVar160._0_4_ + auVar73._0_4_;
    auVar132._4_4_ = auVar160._4_4_ + auVar73._4_4_;
    auVar132._8_4_ = auVar160._8_4_ + auVar73._8_4_;
    auVar132._12_4_ = auVar160._12_4_ + auVar73._12_4_;
    auVar132._16_4_ = auVar160._16_4_ + 0.0;
    auVar132._20_4_ = auVar160._20_4_ + 0.0;
    auVar132._24_4_ = auVar160._24_4_ + 0.0;
    auVar132._28_4_ = 0;
    auVar96 = ZEXT1632(auVar70);
    auVar80 = vpermt2ps_avx512vl(auVar160,_DAT_0205fd20,auVar96);
    auVar81 = vaddps_avx512vl(ZEXT1632(auVar75),auVar91);
    auVar82 = vpermt2ps_avx512vl(auVar91,_DAT_0205fd20,auVar96);
    auVar91 = vsubps_avx(auVar77,auVar80);
    auVar80 = vsubps_avx512vl(auVar79,auVar82);
    auVar82 = vmulps_avx512vl(auVar93,auVar97);
    auVar84 = vmulps_avx512vl(auVar86,auVar97);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar95,auVar83);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar95,auVar85);
    auVar90 = vmulps_avx512vl(auVar94,auVar97);
    auVar92 = vmulps_avx512vl(auVar87,auVar97);
    auVar93 = vfmadd231ps_avx512vl(auVar90,auVar95,auVar93);
    auVar90 = vfmadd231ps_avx512vl(auVar92,auVar95,auVar86);
    auVar92 = vmulps_avx512vl(auVar88,auVar97);
    auVar83 = vmulps_avx512vl(auVar89,auVar97);
    auVar68 = vfmadd231ps_fma(auVar92,auVar95,auVar94);
    auVar69 = vfmadd231ps_fma(auVar83,auVar95,auVar87);
    auVar92 = vmulps_avx512vl(auVar97,auVar93);
    auVar83 = vmulps_avx512vl(ZEXT1632(auVar55),auVar90);
    auVar82 = vfmadd231ps_avx512vl(auVar92,auVar95,auVar82);
    auVar84 = vfmadd231ps_avx512vl(auVar83,auVar95,auVar84);
    auVar93 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar250 * auVar68._12_4_,
                                            CONCAT48(fVar249 * auVar68._8_4_,
                                                     CONCAT44(fVar248 * auVar68._4_4_,
                                                              fVar247 * auVar68._0_4_)))),auVar95,
                         auVar93);
    auVar90 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar250 * auVar69._12_4_,
                                            CONCAT48(fVar249 * auVar69._8_4_,
                                                     CONCAT44(fVar248 * auVar69._4_4_,
                                                              fVar247 * auVar69._0_4_)))),auVar95,
                         auVar90);
    auVar83._4_4_ = fVar248 * auVar93._4_4_;
    auVar83._0_4_ = fVar247 * auVar93._0_4_;
    auVar83._8_4_ = fVar249 * auVar93._8_4_;
    auVar83._12_4_ = fVar250 * auVar93._12_4_;
    auVar83._16_4_ = auVar93._16_4_ * 0.0;
    auVar83._20_4_ = auVar93._20_4_ * 0.0;
    auVar83._24_4_ = auVar93._24_4_ * 0.0;
    auVar83._28_4_ = auVar87._28_4_;
    auVar85._4_4_ = fVar248 * auVar90._4_4_;
    auVar85._0_4_ = fVar247 * auVar90._0_4_;
    auVar85._8_4_ = fVar249 * auVar90._8_4_;
    auVar85._12_4_ = fVar250 * auVar90._12_4_;
    auVar85._16_4_ = auVar90._16_4_ * 0.0;
    auVar85._20_4_ = auVar90._20_4_ * 0.0;
    auVar85._24_4_ = auVar90._24_4_ * 0.0;
    auVar85._28_4_ = auVar94._28_4_;
    auVar94 = vfmadd231ps_avx512vl(auVar83,auVar95,auVar82);
    auVar92 = vfmadd231ps_avx512vl(auVar85,auVar84,auVar95);
    auVar95 = vsubps_avx512vl(auVar93,auVar82);
    auVar93 = vsubps_avx512vl(auVar90,auVar84);
    auVar95 = vmulps_avx512vl(auVar95,auVar78);
    auVar93 = vmulps_avx512vl(auVar93,auVar78);
    fVar234 = fVar252 * auVar95._0_4_;
    fVar247 = fVar252 * auVar95._4_4_;
    auVar86._4_4_ = fVar247;
    auVar86._0_4_ = fVar234;
    fVar248 = fVar252 * auVar95._8_4_;
    auVar86._8_4_ = fVar248;
    fVar249 = fVar252 * auVar95._12_4_;
    auVar86._12_4_ = fVar249;
    fVar250 = fVar252 * auVar95._16_4_;
    auVar86._16_4_ = fVar250;
    fVar251 = fVar252 * auVar95._20_4_;
    auVar86._20_4_ = fVar251;
    fVar252 = fVar252 * auVar95._24_4_;
    auVar86._24_4_ = fVar252;
    auVar86._28_4_ = auVar95._28_4_;
    auVar93 = vmulps_avx512vl(auVar231,auVar93);
    auVar78 = vpermt2ps_avx512vl(auVar94,_DAT_0205fd20,auVar96);
    auVar82 = vpermt2ps_avx512vl(auVar92,_DAT_0205fd20,auVar96);
    auVar232._0_4_ = auVar94._0_4_ + fVar234;
    auVar232._4_4_ = auVar94._4_4_ + fVar247;
    auVar232._8_4_ = auVar94._8_4_ + fVar248;
    auVar232._12_4_ = auVar94._12_4_ + fVar249;
    auVar232._16_4_ = auVar94._16_4_ + fVar250;
    auVar232._20_4_ = auVar94._20_4_ + fVar251;
    auVar232._24_4_ = auVar94._24_4_ + fVar252;
    auVar232._28_4_ = auVar94._28_4_ + auVar95._28_4_;
    auVar95 = vpermt2ps_avx512vl(auVar86,_DAT_0205fd20,ZEXT1632(auVar70));
    auVar84 = vaddps_avx512vl(auVar92,auVar93);
    auVar93 = vpermt2ps_avx512vl(auVar93,_DAT_0205fd20,ZEXT1632(auVar70));
    auVar95 = vsubps_avx(auVar78,auVar95);
    auVar93 = vsubps_avx512vl(auVar82,auVar93);
    auVar149 = ZEXT1632(auVar73);
    auVar90 = vsubps_avx512vl(auVar94,auVar149);
    auVar160 = ZEXT1632(auVar75);
    auVar83 = vsubps_avx512vl(auVar92,auVar160);
    auVar85 = vsubps_avx512vl(auVar78,auVar77);
    auVar90 = vaddps_avx512vl(auVar90,auVar85);
    auVar85 = vsubps_avx512vl(auVar82,auVar79);
    auVar83 = vaddps_avx512vl(auVar83,auVar85);
    auVar85 = vmulps_avx512vl(auVar160,auVar90);
    auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar149,auVar83);
    auVar86 = vmulps_avx512vl(auVar81,auVar90);
    auVar86 = vfnmadd231ps_avx512vl(auVar86,auVar132,auVar83);
    auVar87 = vmulps_avx512vl(auVar80,auVar90);
    auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar91,auVar83);
    auVar88 = vmulps_avx512vl(auVar79,auVar90);
    auVar88 = vfnmadd231ps_avx512vl(auVar88,auVar77,auVar83);
    auVar89 = vmulps_avx512vl(auVar92,auVar90);
    auVar89 = vfnmadd231ps_avx512vl(auVar89,auVar94,auVar83);
    auVar96 = vmulps_avx512vl(auVar84,auVar90);
    auVar96 = vfnmadd231ps_avx512vl(auVar96,auVar232,auVar83);
    auVar97 = vmulps_avx512vl(auVar93,auVar90);
    auVar97 = vfnmadd231ps_avx512vl(auVar97,auVar95,auVar83);
    auVar90 = vmulps_avx512vl(auVar82,auVar90);
    auVar90 = vfnmadd231ps_avx512vl(auVar90,auVar78,auVar83);
    auVar83 = vminps_avx512vl(auVar85,auVar86);
    auVar85 = vmaxps_avx512vl(auVar85,auVar86);
    auVar86 = vminps_avx512vl(auVar87,auVar88);
    auVar83 = vminps_avx512vl(auVar83,auVar86);
    auVar86 = vmaxps_avx512vl(auVar87,auVar88);
    auVar85 = vmaxps_avx512vl(auVar85,auVar86);
    auVar86 = vminps_avx512vl(auVar89,auVar96);
    auVar87 = vmaxps_avx512vl(auVar89,auVar96);
    auVar88 = vminps_avx512vl(auVar97,auVar90);
    auVar86 = vminps_avx512vl(auVar86,auVar88);
    auVar83 = vminps_avx512vl(auVar83,auVar86);
    auVar90 = vmaxps_avx512vl(auVar97,auVar90);
    auVar90 = vmaxps_avx512vl(auVar87,auVar90);
    auVar90 = vmaxps_avx512vl(auVar85,auVar90);
    uVar22 = vcmpps_avx512vl(auVar83,local_1c0,2);
    auVar87._4_4_ = uStack_1dc;
    auVar87._0_4_ = local_1e0;
    auVar87._8_4_ = uStack_1d8;
    auVar87._12_4_ = uStack_1d4;
    auVar87._16_4_ = uStack_1d0;
    auVar87._20_4_ = uStack_1cc;
    auVar87._24_4_ = uStack_1c8;
    auVar87._28_4_ = uStack_1c4;
    uVar23 = vcmpps_avx512vl(auVar90,auVar87,5);
    uVar114 = 0;
    bVar44 = (byte)uVar22 & (byte)uVar23 & 0x7f;
    if (bVar44 != 0) {
      auVar90 = vsubps_avx512vl(auVar77,auVar149);
      auVar83 = vsubps_avx512vl(auVar79,auVar160);
      auVar85 = vsubps_avx512vl(auVar78,auVar94);
      auVar90 = vaddps_avx512vl(auVar90,auVar85);
      auVar85 = vsubps_avx512vl(auVar82,auVar92);
      auVar83 = vaddps_avx512vl(auVar83,auVar85);
      auVar85 = vmulps_avx512vl(auVar160,auVar90);
      auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar83,auVar149);
      auVar81 = vmulps_avx512vl(auVar81,auVar90);
      auVar81 = vfnmadd213ps_avx512vl(auVar132,auVar83,auVar81);
      auVar80 = vmulps_avx512vl(auVar80,auVar90);
      auVar80 = vfnmadd213ps_avx512vl(auVar91,auVar83,auVar80);
      auVar91 = vmulps_avx512vl(auVar79,auVar90);
      auVar79 = vfnmadd231ps_avx512vl(auVar91,auVar83,auVar77);
      auVar91 = vmulps_avx512vl(auVar92,auVar90);
      auVar94 = vfnmadd231ps_avx512vl(auVar91,auVar83,auVar94);
      auVar91 = vmulps_avx512vl(auVar84,auVar90);
      auVar84 = vfnmadd213ps_avx512vl(auVar232,auVar83,auVar91);
      auVar91 = vmulps_avx512vl(auVar93,auVar90);
      auVar92 = vfnmadd213ps_avx512vl(auVar95,auVar83,auVar91);
      auVar95 = vmulps_avx512vl(auVar82,auVar90);
      auVar78 = vfnmadd231ps_avx512vl(auVar95,auVar78,auVar83);
      auVar91 = vminps_avx(auVar85,auVar81);
      auVar95 = vmaxps_avx(auVar85,auVar81);
      auVar77 = vminps_avx(auVar80,auVar79);
      auVar77 = vminps_avx(auVar91,auVar77);
      auVar91 = vmaxps_avx(auVar80,auVar79);
      auVar95 = vmaxps_avx(auVar95,auVar91);
      auVar93 = vminps_avx(auVar94,auVar84);
      auVar91 = vmaxps_avx(auVar94,auVar84);
      auVar94 = vminps_avx(auVar92,auVar78);
      auVar93 = vminps_avx(auVar93,auVar94);
      auVar93 = vminps_avx(auVar77,auVar93);
      auVar77 = vmaxps_avx(auVar92,auVar78);
      auVar91 = vmaxps_avx(auVar91,auVar77);
      auVar95 = vmaxps_avx(auVar95,auVar91);
      uVar22 = vcmpps_avx512vl(auVar95,auVar87,5);
      uVar23 = vcmpps_avx512vl(auVar93,local_1c0,2);
      uVar114 = (uint)(bVar44 & (byte)uVar22 & (byte)uVar23);
    }
    if (uVar114 != 0) {
      auStack_410[uVar46] = uVar114;
      uVar22 = vmovlps_avx(auVar54);
      *(undefined8 *)(&uStack_260 + uVar46 * 2) = uVar22;
      uVar51 = vmovlps_avx(auVar57);
      auStack_1a0[uVar46] = uVar51;
      uVar46 = (ulong)((int)uVar46 + 1);
    }
    auVar95 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar289 = ZEXT3264(auVar95);
    in_ZMM23 = ZEXT464(0x38d1b717);
    do {
      auVar68 = auVar295._0_16_;
      auVar54 = SUB6416(ZEXT464(0xb8d1b717),0);
      auVar55 = SUB6416(ZEXT464(0x38d1b717),0);
      if ((int)uVar46 == 0) {
        uVar117 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar32._4_4_ = uVar117;
        auVar32._0_4_ = uVar117;
        auVar32._8_4_ = uVar117;
        auVar32._12_4_ = uVar117;
        uVar22 = vcmpps_avx512vl(local_3e0,auVar32,2);
        uVar52 = (uint)uVar53 & (uint)uVar53 + 0xf & (uint)uVar22;
        uVar53 = (ulong)uVar52;
        if (uVar52 == 0) {
          return;
        }
        goto LAB_01c5e1ce;
      }
      uVar45 = (int)uVar46 - 1;
      uVar47 = (ulong)uVar45;
      uVar114 = (&uStack_260)[uVar47 * 2];
      fVar252 = afStack_25c[uVar47 * 2];
      uVar7 = auStack_410[uVar47];
      auVar287._8_8_ = 0;
      auVar287._0_8_ = auStack_1a0[uVar47];
      auVar288 = ZEXT1664(auVar287);
      lVar49 = 0;
      for (uVar51 = (ulong)uVar7; (uVar51 & 1) == 0; uVar51 = uVar51 >> 1 | 0x8000000000000000) {
        lVar49 = lVar49 + 1;
      }
      uVar50 = uVar7 - 1 & uVar7;
      auStack_410[uVar47] = uVar50;
      if (uVar50 == 0) {
        uVar46 = (ulong)uVar45;
      }
      auVar70 = vpxord_avx512vl(auVar293._0_16_,auVar293._0_16_);
      auVar69 = vcvtsi2ss_avx512f(auVar70,lVar49);
      auVar72 = vmulss_avx512f(auVar69,SUB6416(ZEXT464(0x3e124925),0));
      lVar49 = lVar49 + 1;
      auVar69 = vpxord_avx512vl(auVar70,auVar70);
      auVar69 = vcvtsi2ss_avx512f(auVar69,lVar49);
      auVar70 = vmulss_avx512f(auVar69,SUB6416(ZEXT464(0x3e124925),0));
      auVar73 = auVar292._0_16_;
      auVar69 = vsubss_avx512f(auVar73,auVar72);
      auVar69 = vfmadd231ss_fma(ZEXT416((uint)(fVar252 * auVar72._0_4_)),ZEXT416(uVar114),auVar69);
      auVar72 = vsubss_avx512f(auVar73,auVar70);
      auVar70 = vfmadd231ss_fma(ZEXT416((uint)(fVar252 * auVar70._0_4_)),ZEXT416(uVar114),auVar72);
      fVar234 = auVar70._0_4_;
      fVar247 = auVar69._0_4_;
      fVar252 = fVar234 - fVar247;
      vucomiss_avx512f(ZEXT416((uint)fVar252));
      if (uVar7 == 0 || lVar49 == 0) break;
      auVar293 = ZEXT1664(auVar287);
      auVar72 = vshufps_avx(auVar287,auVar287,0x50);
      vucomiss_avx512f(ZEXT416((uint)fVar252));
      uVar114 = (uint)uVar46;
      auVar141 = auVar291._0_16_;
      auVar58 = vsubps_avx512vl(auVar141,auVar72);
      fVar248 = auVar72._0_4_;
      auVar143._0_4_ = fVar176 * fVar248;
      fVar249 = auVar72._4_4_;
      auVar143._4_4_ = fVar191 * fVar249;
      fVar250 = auVar72._8_4_;
      auVar143._8_4_ = fVar176 * fVar250;
      fVar251 = auVar72._12_4_;
      auVar143._12_4_ = fVar191 * fVar251;
      auVar157._0_4_ = fVar233 * fVar248;
      auVar157._4_4_ = fVar246 * fVar249;
      auVar157._8_4_ = fVar233 * fVar250;
      auVar157._12_4_ = fVar246 * fVar251;
      auVar170._0_4_ = fVar253 * fVar248;
      auVar170._4_4_ = fVar260 * fVar249;
      auVar170._8_4_ = fVar253 * fVar250;
      auVar170._12_4_ = fVar260 * fVar251;
      auVar127._0_4_ = fVar192 * fVar248;
      auVar127._4_4_ = fVar205 * fVar249;
      auVar127._8_4_ = fVar192 * fVar250;
      auVar127._12_4_ = fVar205 * fVar251;
      auVar72 = vfmadd231ps_fma(auVar143,auVar58,local_420);
      auVar75 = vfmadd231ps_fma(auVar157,auVar58,local_430);
      auVar57 = vfmadd231ps_fma(auVar170,auVar58,local_440);
      auVar58 = vfmadd231ps_fma(auVar127,auVar58,local_450);
      auVar140._16_16_ = auVar72;
      auVar140._0_16_ = auVar72;
      auVar150._16_16_ = auVar75;
      auVar150._0_16_ = auVar75;
      auVar161._16_16_ = auVar57;
      auVar161._0_16_ = auVar57;
      auVar190._4_4_ = fVar247;
      auVar190._0_4_ = fVar247;
      auVar190._8_4_ = fVar247;
      auVar190._12_4_ = fVar247;
      auVar190._20_4_ = fVar234;
      auVar190._16_4_ = fVar234;
      auVar190._24_4_ = fVar234;
      auVar190._28_4_ = fVar234;
      auVar95 = vsubps_avx(auVar150,auVar140);
      auVar75 = vfmadd213ps_fma(auVar95,auVar190,auVar140);
      auVar95 = vsubps_avx(auVar161,auVar150);
      auVar59 = vfmadd213ps_fma(auVar95,auVar190,auVar150);
      auVar72 = vsubps_avx(auVar58,auVar57);
      auVar151._16_16_ = auVar72;
      auVar151._0_16_ = auVar72;
      auVar72 = vfmadd213ps_fma(auVar151,auVar190,auVar161);
      auVar95 = vsubps_avx(ZEXT1632(auVar59),ZEXT1632(auVar75));
      auVar75 = vfmadd213ps_fma(auVar95,auVar190,ZEXT1632(auVar75));
      auVar95 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar59));
      auVar72 = vfmadd213ps_fma(auVar95,auVar190,ZEXT1632(auVar59));
      auVar95 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar75));
      auVar76 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar95,auVar190);
      auVar95 = vmulps_avx512vl(auVar95,auVar289._0_32_);
      auVar72 = vmulss_avx512f(ZEXT416((uint)fVar252),SUB6416(ZEXT464(0x3eaaaaab),0));
      fVar234 = auVar72._0_4_;
      auVar171._0_8_ =
           CONCAT44(auVar76._4_4_ + fVar234 * auVar95._4_4_,auVar76._0_4_ + fVar234 * auVar95._0_4_)
      ;
      auVar171._8_4_ = auVar76._8_4_ + fVar234 * auVar95._8_4_;
      auVar171._12_4_ = auVar76._12_4_ + fVar234 * auVar95._12_4_;
      auVar144._0_4_ = fVar234 * auVar95._16_4_;
      auVar144._4_4_ = fVar234 * auVar95._20_4_;
      auVar144._8_4_ = fVar234 * auVar95._24_4_;
      auVar144._12_4_ = fVar234 * auVar95._28_4_;
      auVar67 = vsubps_avx((undefined1  [16])0x0,auVar144);
      auVar61 = vshufpd_avx(auVar76,auVar76,3);
      auVar62 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar72 = vsubps_avx(auVar61,auVar76);
      auVar75 = vsubps_avx(auVar62,(undefined1  [16])0x0);
      auVar196._0_4_ = auVar75._0_4_ + auVar72._0_4_;
      auVar196._4_4_ = auVar75._4_4_ + auVar72._4_4_;
      auVar196._8_4_ = auVar75._8_4_ + auVar72._8_4_;
      auVar196._12_4_ = auVar75._12_4_ + auVar72._12_4_;
      auVar72 = vshufps_avx(auVar76,auVar76,0xb1);
      auVar75 = vshufps_avx(auVar171,auVar171,0xb1);
      auVar57 = vshufps_avx(auVar67,auVar67,0xb1);
      auVar58 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar263._4_4_ = auVar196._0_4_;
      auVar263._0_4_ = auVar196._0_4_;
      auVar263._8_4_ = auVar196._0_4_;
      auVar263._12_4_ = auVar196._0_4_;
      auVar59 = vshufps_avx(auVar196,auVar196,0x55);
      fVar234 = auVar59._0_4_;
      auVar214._0_4_ = auVar72._0_4_ * fVar234;
      fVar247 = auVar59._4_4_;
      auVar214._4_4_ = auVar72._4_4_ * fVar247;
      fVar248 = auVar59._8_4_;
      auVar214._8_4_ = auVar72._8_4_ * fVar248;
      fVar249 = auVar59._12_4_;
      auVar214._12_4_ = auVar72._12_4_ * fVar249;
      auVar228._0_4_ = auVar75._0_4_ * fVar234;
      auVar228._4_4_ = auVar75._4_4_ * fVar247;
      auVar228._8_4_ = auVar75._8_4_ * fVar248;
      auVar228._12_4_ = auVar75._12_4_ * fVar249;
      auVar238._0_4_ = auVar57._0_4_ * fVar234;
      auVar238._4_4_ = auVar57._4_4_ * fVar247;
      auVar238._8_4_ = auVar57._8_4_ * fVar248;
      auVar238._12_4_ = auVar57._12_4_ * fVar249;
      auVar197._0_4_ = auVar58._0_4_ * fVar234;
      auVar197._4_4_ = auVar58._4_4_ * fVar247;
      auVar197._8_4_ = auVar58._8_4_ * fVar248;
      auVar197._12_4_ = auVar58._12_4_ * fVar249;
      auVar72 = vfmadd231ps_fma(auVar214,auVar263,auVar76);
      auVar75 = vfmadd231ps_fma(auVar228,auVar263,auVar171);
      auVar59 = vfmadd231ps_fma(auVar238,auVar263,auVar67);
      auVar133 = vfmadd231ps_fma(auVar197,(undefined1  [16])0x0,auVar263);
      auVar60 = vshufpd_avx(auVar72,auVar72,1);
      auVar63 = vshufpd_avx(auVar75,auVar75,1);
      auVar64 = vshufpd_avx(auVar59,auVar59,1);
      auVar66 = vshufpd_avx(auVar133,auVar133,1);
      auVar57 = vminss_avx(auVar72,auVar75);
      auVar72 = vmaxss_avx(auVar75,auVar72);
      auVar58 = vminss_avx(auVar59,auVar133);
      auVar75 = vmaxss_avx(auVar133,auVar59);
      auVar58 = vminss_avx(auVar57,auVar58);
      auVar72 = vmaxss_avx(auVar75,auVar72);
      auVar59 = vminss_avx(auVar60,auVar63);
      auVar75 = vmaxss_avx(auVar63,auVar60);
      auVar60 = vminss_avx(auVar64,auVar66);
      auVar57 = vmaxss_avx(auVar66,auVar64);
      auVar59 = vminss_avx(auVar59,auVar60);
      auVar75 = vmaxss_avx(auVar57,auVar75);
      auVar57 = vucomiss_avx512f(auVar58);
      in_ZMM23 = ZEXT1664(auVar57);
      if ((uVar114 < 5) || (auVar75 = vucomiss_avx512f(auVar54), uVar114 < 5)) {
        auVar72 = vucomiss_avx512f(auVar54);
        uVar22 = vcmpps_avx512vl(auVar59,auVar55,1);
        uVar23 = vcmpps_avx512vl(auVar58,auVar55,1);
        if ((4 < uVar114 & ((byte)uVar23 | (byte)uVar22)) != 0) goto LAB_01c5f4f1;
        uVar22 = vcmpps_avx512vl(auVar54,auVar75,5);
        uVar23 = vcmpps_avx512vl(auVar59,auVar55,5);
        if ((((ushort)uVar23 | (ushort)uVar22) & 1) == 0) goto LAB_01c5f4f1;
LAB_01c5ff6c:
        bVar14 = true;
        auVar288 = ZEXT1664(auVar287);
      }
      else {
LAB_01c5f4f1:
        uVar22 = vcmpss_avx512f(auVar58,auVar68,1);
        bVar14 = (bool)((byte)uVar22 & 1);
        iVar115 = auVar292._0_4_;
        fVar234 = (float)((uint)bVar14 * -0x40800000 + (uint)!bVar14 * iVar115);
        uVar22 = vcmpss_avx512f(auVar72,auVar68,1);
        bVar14 = (bool)((byte)uVar22 & 1);
        fVar247 = (float)((uint)bVar14 * -0x40800000 + (uint)!bVar14 * iVar115);
        bVar14 = fVar234 != fVar247;
        iVar294 = auVar295._0_4_;
        auVar95._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar98._4_28_ = auVar95._4_28_;
        auVar98._0_4_ = (uint)bVar14 * iVar294 + (uint)!bVar14 * 0x7f800000;
        auVar55 = auVar98._0_16_;
        auVar100._16_16_ = auVar95._16_16_;
        auVar100._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar99._4_28_ = auVar100._4_28_;
        auVar99._0_4_ = (uint)bVar14 * iVar294 + (uint)!bVar14 * -0x800000;
        auVar54 = auVar99._0_16_;
        uVar22 = vcmpss_avx512f(auVar59,auVar68,1);
        bVar14 = (bool)((byte)uVar22 & 1);
        fVar248 = (float)((uint)bVar14 * -0x40800000 + (uint)!bVar14 * iVar115);
        if ((fVar234 != fVar248) || (NAN(fVar234) || NAN(fVar248))) {
          fVar249 = auVar59._0_4_;
          fVar234 = auVar58._0_4_;
          bVar14 = fVar249 == fVar234;
          if ((!bVar14) || (NAN(fVar249) || NAN(fVar234))) {
            auVar31._8_4_ = 0x80000000;
            auVar31._0_8_ = 0x8000000080000000;
            auVar31._12_4_ = 0x80000000;
            auVar57 = vxorps_avx512vl(auVar58,auVar31);
            auVar280._0_4_ = auVar57._0_4_ / (fVar249 - fVar234);
            auVar280._4_12_ = auVar57._4_12_;
            auVar57 = vsubss_avx512f(auVar73,auVar280);
            auVar58 = vfmadd213ss_avx512f(auVar57,auVar68,auVar280);
            auVar57 = auVar58;
          }
          else {
            vucomiss_avx512f(auVar68);
            auVar102._16_16_ = auVar95._16_16_;
            auVar102._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar101._4_28_ = auVar102._4_28_;
            auVar101._0_4_ = (uint)bVar14 * iVar294 + (uint)!bVar14 * 0x7f800000;
            auVar58 = auVar101._0_16_;
            auVar57 = ZEXT416((uint)bVar14 * 0x3f800000 + (uint)!bVar14 * -0x800000);
          }
          auVar55 = vminss_avx(auVar55,auVar58);
          auVar54 = vmaxss_avx(auVar57,auVar54);
        }
        uVar22 = vcmpss_avx512f(auVar75,auVar68,1);
        bVar14 = (bool)((byte)uVar22 & 1);
        fVar234 = (float)((uint)bVar14 * -0x40800000 + (uint)!bVar14 * iVar115);
        if ((fVar247 != fVar234) || (NAN(fVar247) || NAN(fVar234))) {
          fVar249 = auVar75._0_4_;
          fVar247 = auVar72._0_4_;
          bVar14 = fVar249 == fVar247;
          if ((!bVar14) || (NAN(fVar249) || NAN(fVar247))) {
            auVar30._8_4_ = 0x80000000;
            auVar30._0_8_ = 0x8000000080000000;
            auVar30._12_4_ = 0x80000000;
            auVar72 = vxorps_avx512vl(auVar72,auVar30);
            auVar239._0_4_ = auVar72._0_4_ / (fVar249 - fVar247);
            auVar239._4_12_ = auVar72._4_12_;
            auVar72 = vsubss_avx512f(auVar73,auVar239);
            auVar75 = vfmadd213ss_avx512f(auVar72,auVar68,auVar239);
            auVar72 = auVar75;
          }
          else {
            vucomiss_avx512f(auVar68);
            auVar104._16_16_ = auVar95._16_16_;
            auVar104._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar103._4_28_ = auVar104._4_28_;
            auVar103._0_4_ = (uint)bVar14 * iVar294 + (uint)!bVar14 * 0x7f800000;
            auVar75 = auVar103._0_16_;
            auVar72 = ZEXT416((uint)bVar14 * 0x3f800000 + (uint)!bVar14 * -0x800000);
          }
          auVar55 = vminss_avx(auVar55,auVar75);
          auVar54 = vmaxss_avx(auVar72,auVar54);
        }
        bVar14 = fVar248 != fVar234;
        auVar72 = vminss_avx512f(auVar55,auVar73);
        auVar106._16_16_ = auVar95._16_16_;
        auVar106._0_16_ = auVar55;
        auVar105._4_28_ = auVar106._4_28_;
        auVar105._0_4_ = (uint)bVar14 * auVar72._0_4_ + (uint)!bVar14 * auVar55._0_4_;
        auVar55 = vmaxss_avx512f(auVar73,auVar54);
        auVar108._16_16_ = auVar95._16_16_;
        auVar108._0_16_ = auVar54;
        auVar107._4_28_ = auVar108._4_28_;
        auVar107._0_4_ = (uint)bVar14 * auVar55._0_4_ + (uint)!bVar14 * auVar54._0_4_;
        auVar54 = vmaxss_avx512f(auVar68,auVar105._0_16_);
        auVar55 = vminss_avx512f(auVar107._0_16_,auVar73);
        bVar14 = true;
        if (auVar55._0_4_ < auVar54._0_4_) goto LAB_01c5ff6c;
        auVar75 = vmaxss_avx512f(auVar68,ZEXT416((uint)(auVar54._0_4_ + -0.1)));
        auVar63 = vminss_avx512f(ZEXT416((uint)(auVar55._0_4_ + 0.1)),auVar73);
        auVar128._0_8_ = auVar76._0_8_;
        auVar128._8_8_ = auVar128._0_8_;
        auVar229._8_8_ = auVar171._0_8_;
        auVar229._0_8_ = auVar171._0_8_;
        auVar240._8_8_ = auVar67._0_8_;
        auVar240._0_8_ = auVar67._0_8_;
        auVar54 = vshufpd_avx(auVar171,auVar171,3);
        auVar55 = vshufpd_avx(auVar67,auVar67,3);
        auVar72 = vshufps_avx(auVar75,auVar63,0);
        auVar60 = vsubps_avx512vl(auVar141,auVar72);
        fVar234 = auVar72._0_4_;
        auVar274._0_4_ = fVar234 * auVar61._0_4_;
        fVar247 = auVar72._4_4_;
        auVar274._4_4_ = fVar247 * auVar61._4_4_;
        fVar248 = auVar72._8_4_;
        auVar274._8_4_ = fVar248 * auVar61._8_4_;
        fVar249 = auVar72._12_4_;
        auVar274._12_4_ = fVar249 * auVar61._12_4_;
        auVar172._0_4_ = fVar234 * auVar54._0_4_;
        auVar172._4_4_ = fVar247 * auVar54._4_4_;
        auVar172._8_4_ = fVar248 * auVar54._8_4_;
        auVar172._12_4_ = fVar249 * auVar54._12_4_;
        auVar187._0_4_ = fVar234 * auVar55._0_4_;
        auVar187._4_4_ = fVar247 * auVar55._4_4_;
        auVar187._8_4_ = fVar248 * auVar55._8_4_;
        auVar187._12_4_ = fVar249 * auVar55._12_4_;
        auVar145._0_4_ = fVar234 * auVar62._0_4_;
        auVar145._4_4_ = fVar247 * auVar62._4_4_;
        auVar145._8_4_ = fVar248 * auVar62._8_4_;
        auVar145._12_4_ = fVar249 * auVar62._12_4_;
        auVar57 = vfmadd231ps_fma(auVar274,auVar60,auVar128);
        auVar58 = vfmadd231ps_fma(auVar172,auVar60,auVar229);
        auVar59 = vfmadd231ps_fma(auVar187,auVar60,auVar240);
        auVar60 = vfmadd231ps_fma(auVar145,auVar60,ZEXT816(0));
        auVar55 = vsubss_avx512f(auVar73,auVar75);
        auVar54 = vmovshdup_avx(auVar287);
        auVar67 = vfmadd231ss_fma(ZEXT416((uint)(auVar54._0_4_ * auVar75._0_4_)),auVar287,auVar55);
        auVar55 = vsubss_avx512f(auVar73,auVar63);
        auVar133 = vfmadd231ss_fma(ZEXT416((uint)(auVar63._0_4_ * auVar54._0_4_)),auVar287,auVar55);
        auVar61 = vdivss_avx512f(auVar73,ZEXT416((uint)fVar252));
        auVar54 = vsubps_avx(auVar58,auVar57);
        auVar136._0_4_ = auVar54._0_4_ * 3.0;
        auVar136._4_4_ = auVar54._4_4_ * 3.0;
        auVar136._8_4_ = auVar54._8_4_ * 3.0;
        auVar136._12_4_ = auVar54._12_4_ * 3.0;
        auVar54 = vsubps_avx(auVar59,auVar58);
        auVar198._0_4_ = auVar54._0_4_ * 3.0;
        auVar198._4_4_ = auVar54._4_4_ * 3.0;
        auVar198._8_4_ = auVar54._8_4_ * 3.0;
        auVar198._12_4_ = auVar54._12_4_ * 3.0;
        auVar54 = vsubps_avx(auVar60,auVar59);
        auVar215._0_4_ = auVar54._0_4_ * 3.0;
        auVar215._4_4_ = auVar54._4_4_ * 3.0;
        auVar215._8_4_ = auVar54._8_4_ * 3.0;
        auVar215._12_4_ = auVar54._12_4_ * 3.0;
        auVar55 = vminps_avx(auVar198,auVar215);
        auVar54 = vmaxps_avx(auVar198,auVar215);
        auVar55 = vminps_avx(auVar136,auVar55);
        auVar54 = vmaxps_avx(auVar136,auVar54);
        auVar72 = vshufpd_avx(auVar55,auVar55,3);
        auVar75 = vshufpd_avx(auVar54,auVar54,3);
        auVar55 = vminps_avx(auVar55,auVar72);
        auVar54 = vmaxps_avx(auVar54,auVar75);
        fVar252 = auVar61._0_4_;
        auVar216._0_4_ = fVar252 * auVar55._0_4_;
        auVar216._4_4_ = fVar252 * auVar55._4_4_;
        auVar216._8_4_ = fVar252 * auVar55._8_4_;
        auVar216._12_4_ = fVar252 * auVar55._12_4_;
        auVar199._0_4_ = fVar252 * auVar54._0_4_;
        auVar199._4_4_ = fVar252 * auVar54._4_4_;
        auVar199._8_4_ = fVar252 * auVar54._8_4_;
        auVar199._12_4_ = fVar252 * auVar54._12_4_;
        auVar61 = vdivss_avx512f(auVar73,ZEXT416((uint)(auVar133._0_4_ - auVar67._0_4_)));
        auVar54 = vshufpd_avx(auVar57,auVar57,3);
        auVar55 = vshufpd_avx(auVar58,auVar58,3);
        auVar72 = vshufpd_avx(auVar59,auVar59,3);
        auVar75 = vshufpd_avx(auVar60,auVar60,3);
        auVar54 = vsubps_avx(auVar54,auVar57);
        auVar57 = vsubps_avx(auVar55,auVar58);
        auVar58 = vsubps_avx(auVar72,auVar59);
        auVar75 = vsubps_avx(auVar75,auVar60);
        auVar55 = vminps_avx(auVar54,auVar57);
        auVar54 = vmaxps_avx(auVar54,auVar57);
        auVar72 = vminps_avx(auVar58,auVar75);
        auVar72 = vminps_avx(auVar55,auVar72);
        auVar55 = vmaxps_avx(auVar58,auVar75);
        auVar54 = vmaxps_avx(auVar54,auVar55);
        fVar252 = auVar61._0_4_;
        auVar241._0_4_ = fVar252 * auVar72._0_4_;
        auVar241._4_4_ = fVar252 * auVar72._4_4_;
        auVar241._8_4_ = fVar252 * auVar72._8_4_;
        auVar241._12_4_ = fVar252 * auVar72._12_4_;
        auVar255._0_4_ = fVar252 * auVar54._0_4_;
        auVar255._4_4_ = fVar252 * auVar54._4_4_;
        auVar255._8_4_ = fVar252 * auVar54._8_4_;
        auVar255._12_4_ = fVar252 * auVar54._12_4_;
        auVar293 = ZEXT1664(auVar69);
        auVar66 = vinsertps_avx512f(auVar69,auVar67,0x10);
        auVar57 = vinsertps_avx(auVar70,auVar133,0x10);
        auVar122._0_4_ = auVar66._0_4_ + auVar57._0_4_;
        auVar122._4_4_ = auVar66._4_4_ + auVar57._4_4_;
        auVar122._8_4_ = auVar66._8_4_ + auVar57._8_4_;
        auVar122._12_4_ = auVar66._12_4_ + auVar57._12_4_;
        auVar28._8_4_ = 0x3f000000;
        auVar28._0_8_ = 0x3f0000003f000000;
        auVar28._12_4_ = 0x3f000000;
        auVar63 = vmulps_avx512vl(auVar122,auVar28);
        auVar72 = vshufps_avx(auVar63,auVar63,0x54);
        uVar117 = auVar63._0_4_;
        auVar137._4_4_ = uVar117;
        auVar137._0_4_ = uVar117;
        auVar137._8_4_ = uVar117;
        auVar137._12_4_ = uVar117;
        auVar58 = vfmadd213ps_avx512vl(local_270,auVar137,auVar56);
        auVar55 = vfmadd213ps_fma(local_280,auVar137,auVar65);
        auVar75 = vfmadd213ps_fma(local_290,auVar137,auVar71);
        auVar54 = vsubps_avx(auVar55,auVar58);
        auVar58 = vfmadd213ps_fma(auVar54,auVar137,auVar58);
        auVar54 = vsubps_avx(auVar75,auVar55);
        auVar54 = vfmadd213ps_fma(auVar54,auVar137,auVar55);
        auVar54 = vsubps_avx(auVar54,auVar58);
        auVar55 = vfmadd231ps_fma(auVar58,auVar54,auVar137);
        auVar138._0_8_ = CONCAT44(auVar54._4_4_ * 3.0,auVar54._0_4_ * 3.0);
        auVar138._8_4_ = auVar54._8_4_ * 3.0;
        auVar138._12_4_ = auVar54._12_4_ * 3.0;
        auVar264._8_8_ = auVar55._0_8_;
        auVar264._0_8_ = auVar55._0_8_;
        auVar54 = vshufpd_avx(auVar55,auVar55,3);
        auVar55 = vshufps_avx(auVar63,auVar63,0x55);
        auVar75 = vsubps_avx(auVar54,auVar264);
        auVar58 = vfmadd231ps_fma(auVar264,auVar55,auVar75);
        auVar281._8_8_ = auVar138._0_8_;
        auVar281._0_8_ = auVar138._0_8_;
        auVar54 = vshufpd_avx(auVar138,auVar138,3);
        auVar54 = vsubps_avx(auVar54,auVar281);
        auVar55 = vfmadd213ps_fma(auVar54,auVar55,auVar281);
        auVar139._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
        auVar139._8_4_ = auVar75._8_4_ ^ 0x80000000;
        auVar139._12_4_ = auVar75._12_4_ ^ 0x80000000;
        auVar54 = vmovshdup_avx(auVar55);
        auVar282._0_8_ = auVar54._0_8_ ^ 0x8000000080000000;
        auVar282._8_4_ = auVar54._8_4_ ^ 0x80000000;
        auVar282._12_4_ = auVar54._12_4_ ^ 0x80000000;
        auVar59 = vmovshdup_avx512vl(auVar75);
        auVar60 = vpermt2ps_avx512vl(auVar282,ZEXT416(5),auVar75);
        auVar54 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar54._0_4_ * auVar75._0_4_)),auVar55,auVar59
                                     );
        auVar55 = vpermt2ps_avx512vl(auVar55,SUB6416(ZEXT464(4),0),auVar139);
        auVar146._0_4_ = auVar54._0_4_;
        auVar146._4_4_ = auVar146._0_4_;
        auVar146._8_4_ = auVar146._0_4_;
        auVar146._12_4_ = auVar146._0_4_;
        auVar54 = vdivps_avx(auVar60,auVar146);
        auVar55 = vdivps_avx(auVar55,auVar146);
        fVar234 = auVar58._0_4_;
        auVar75 = vshufps_avx(auVar58,auVar58,0x55);
        fVar252 = auVar55._0_4_;
        auVar265._0_4_ = fVar234 * auVar54._0_4_ + auVar75._0_4_ * fVar252;
        auVar265._4_4_ = fVar234 * auVar54._4_4_ + auVar75._4_4_ * auVar55._4_4_;
        auVar265._8_4_ = fVar234 * auVar54._8_4_ + auVar75._8_4_ * auVar55._8_4_;
        auVar265._12_4_ = fVar234 * auVar54._12_4_ + auVar75._12_4_ * auVar55._12_4_;
        auVar64 = vsubps_avx(auVar72,auVar265);
        auVar58 = vmovshdup_avx(auVar54);
        auVar72 = vinsertps_avx(auVar216,auVar241,0x1c);
        auVar283._0_4_ = auVar58._0_4_ * auVar72._0_4_;
        auVar283._4_4_ = auVar58._4_4_ * auVar72._4_4_;
        auVar283._8_4_ = auVar58._8_4_ * auVar72._8_4_;
        auVar283._12_4_ = auVar58._12_4_ * auVar72._12_4_;
        auVar75 = vinsertps_avx(auVar199,auVar255,0x1c);
        auVar266._0_4_ = auVar58._0_4_ * auVar75._0_4_;
        auVar266._4_4_ = auVar58._4_4_ * auVar75._4_4_;
        auVar266._8_4_ = auVar58._8_4_ * auVar75._8_4_;
        auVar266._12_4_ = auVar58._12_4_ * auVar75._12_4_;
        auVar62 = vminps_avx512vl(auVar283,auVar266);
        auVar60 = vmaxps_avx(auVar266,auVar283);
        auVar61 = vmovshdup_avx(auVar55);
        auVar58 = vinsertps_avx(auVar241,auVar216,0x4c);
        auVar242._0_4_ = auVar61._0_4_ * auVar58._0_4_;
        auVar242._4_4_ = auVar61._4_4_ * auVar58._4_4_;
        auVar242._8_4_ = auVar61._8_4_ * auVar58._8_4_;
        auVar242._12_4_ = auVar61._12_4_ * auVar58._12_4_;
        auVar59 = vinsertps_avx(auVar255,auVar199,0x4c);
        auVar256._0_4_ = auVar61._0_4_ * auVar59._0_4_;
        auVar256._4_4_ = auVar61._4_4_ * auVar59._4_4_;
        auVar256._8_4_ = auVar61._8_4_ * auVar59._8_4_;
        auVar256._12_4_ = auVar61._12_4_ * auVar59._12_4_;
        auVar61 = vminps_avx(auVar242,auVar256);
        auVar62 = vaddps_avx512vl(auVar62,auVar61);
        auVar61 = vmaxps_avx(auVar256,auVar242);
        auVar243._0_4_ = auVar60._0_4_ + auVar61._0_4_;
        auVar243._4_4_ = auVar60._4_4_ + auVar61._4_4_;
        auVar243._8_4_ = auVar60._8_4_ + auVar61._8_4_;
        auVar243._12_4_ = auVar60._12_4_ + auVar61._12_4_;
        auVar257._8_8_ = 0x3f80000000000000;
        auVar257._0_8_ = 0x3f80000000000000;
        auVar60 = vsubps_avx(auVar257,auVar243);
        auVar61 = vsubps_avx(auVar257,auVar62);
        auVar62 = vsubps_avx(auVar66,auVar63);
        auVar63 = vsubps_avx(auVar57,auVar63);
        fVar250 = auVar62._0_4_;
        auVar284._0_4_ = fVar250 * auVar60._0_4_;
        fVar251 = auVar62._4_4_;
        auVar284._4_4_ = fVar251 * auVar60._4_4_;
        fVar206 = auVar62._8_4_;
        auVar284._8_4_ = fVar206 * auVar60._8_4_;
        fVar224 = auVar62._12_4_;
        auVar284._12_4_ = fVar224 * auVar60._12_4_;
        auVar76 = vbroadcastss_avx512vl(auVar54);
        auVar72 = vmulps_avx512vl(auVar76,auVar72);
        auVar75 = vmulps_avx512vl(auVar76,auVar75);
        auVar76 = vminps_avx512vl(auVar72,auVar75);
        auVar72 = vmaxps_avx(auVar75,auVar72);
        auVar217._0_4_ = fVar252 * auVar58._0_4_;
        auVar217._4_4_ = fVar252 * auVar58._4_4_;
        auVar217._8_4_ = fVar252 * auVar58._8_4_;
        auVar217._12_4_ = fVar252 * auVar58._12_4_;
        auVar200._0_4_ = fVar252 * auVar59._0_4_;
        auVar200._4_4_ = fVar252 * auVar59._4_4_;
        auVar200._8_4_ = fVar252 * auVar59._8_4_;
        auVar200._12_4_ = fVar252 * auVar59._12_4_;
        auVar75 = vminps_avx(auVar217,auVar200);
        auVar58 = vaddps_avx512vl(auVar76,auVar75);
        auVar59 = vmulps_avx512vl(auVar62,auVar61);
        fVar234 = auVar63._0_4_;
        auVar244._0_4_ = fVar234 * auVar60._0_4_;
        fVar247 = auVar63._4_4_;
        auVar244._4_4_ = fVar247 * auVar60._4_4_;
        fVar248 = auVar63._8_4_;
        auVar244._8_4_ = fVar248 * auVar60._8_4_;
        fVar249 = auVar63._12_4_;
        auVar244._12_4_ = fVar249 * auVar60._12_4_;
        auVar258._0_4_ = fVar234 * auVar61._0_4_;
        auVar258._4_4_ = fVar247 * auVar61._4_4_;
        auVar258._8_4_ = fVar248 * auVar61._8_4_;
        auVar258._12_4_ = fVar249 * auVar61._12_4_;
        auVar75 = vmaxps_avx(auVar200,auVar217);
        auVar201._0_4_ = auVar72._0_4_ + auVar75._0_4_;
        auVar201._4_4_ = auVar72._4_4_ + auVar75._4_4_;
        auVar201._8_4_ = auVar72._8_4_ + auVar75._8_4_;
        auVar201._12_4_ = auVar72._12_4_ + auVar75._12_4_;
        auVar218._8_8_ = 0x3f800000;
        auVar218._0_8_ = 0x3f800000;
        auVar72 = vsubps_avx(auVar218,auVar201);
        auVar75 = vsubps_avx(auVar218,auVar58);
        auVar275._0_4_ = fVar250 * auVar72._0_4_;
        auVar275._4_4_ = fVar251 * auVar72._4_4_;
        auVar275._8_4_ = fVar206 * auVar72._8_4_;
        auVar275._12_4_ = fVar224 * auVar72._12_4_;
        auVar267._0_4_ = fVar250 * auVar75._0_4_;
        auVar267._4_4_ = fVar251 * auVar75._4_4_;
        auVar267._8_4_ = fVar206 * auVar75._8_4_;
        auVar267._12_4_ = fVar224 * auVar75._12_4_;
        auVar202._0_4_ = fVar234 * auVar72._0_4_;
        auVar202._4_4_ = fVar247 * auVar72._4_4_;
        auVar202._8_4_ = fVar248 * auVar72._8_4_;
        auVar202._12_4_ = fVar249 * auVar72._12_4_;
        auVar219._0_4_ = fVar234 * auVar75._0_4_;
        auVar219._4_4_ = fVar247 * auVar75._4_4_;
        auVar219._8_4_ = fVar248 * auVar75._8_4_;
        auVar219._12_4_ = fVar249 * auVar75._12_4_;
        auVar72 = vminps_avx(auVar275,auVar267);
        auVar75 = vminps_avx(auVar202,auVar219);
        auVar58 = vminps_avx(auVar72,auVar75);
        auVar72 = vmaxps_avx(auVar267,auVar275);
        auVar75 = vmaxps_avx(auVar219,auVar202);
        auVar75 = vmaxps_avx(auVar75,auVar72);
        auVar60 = vminps_avx512vl(auVar284,auVar59);
        auVar72 = vminps_avx(auVar244,auVar258);
        auVar72 = vminps_avx(auVar60,auVar72);
        auVar72 = vhaddps_avx(auVar58,auVar72);
        auVar59 = vmaxps_avx512vl(auVar59,auVar284);
        auVar58 = vmaxps_avx(auVar258,auVar244);
        auVar58 = vmaxps_avx(auVar58,auVar59);
        auVar75 = vhaddps_avx(auVar75,auVar58);
        auVar72 = vshufps_avx(auVar72,auVar72,0xe8);
        auVar75 = vshufps_avx(auVar75,auVar75,0xe8);
        auVar203._0_4_ = auVar72._0_4_ + auVar64._0_4_;
        auVar203._4_4_ = auVar72._4_4_ + auVar64._4_4_;
        auVar203._8_4_ = auVar72._8_4_ + auVar64._8_4_;
        auVar203._12_4_ = auVar72._12_4_ + auVar64._12_4_;
        auVar220._0_4_ = auVar75._0_4_ + auVar64._0_4_;
        auVar220._4_4_ = auVar75._4_4_ + auVar64._4_4_;
        auVar220._8_4_ = auVar75._8_4_ + auVar64._8_4_;
        auVar220._12_4_ = auVar75._12_4_ + auVar64._12_4_;
        auVar72 = vmaxps_avx(auVar66,auVar203);
        auVar75 = vminps_avx(auVar220,auVar57);
        uVar51 = vcmpps_avx512vl(auVar75,auVar72,1);
        auVar72 = vinsertps_avx(auVar67,auVar133,0x10);
        auVar288 = ZEXT1664(auVar72);
        if ((uVar51 & 3) == 0) {
          vucomiss_avx512f(auVar69);
          auVar291 = ZEXT1664(auVar141);
          if (uVar114 < 4 && (uVar7 == 0 || lVar49 == 0)) {
            bVar14 = false;
          }
          else {
            lVar49 = 200;
            do {
              auVar75 = vsubss_avx512f(auVar73,auVar64);
              fVar248 = auVar75._0_4_;
              fVar234 = fVar248 * fVar248 * fVar248;
              fVar249 = auVar64._0_4_;
              fVar247 = fVar249 * 3.0 * fVar248 * fVar248;
              fVar248 = fVar248 * fVar249 * fVar249 * 3.0;
              auVar173._4_4_ = fVar234;
              auVar173._0_4_ = fVar234;
              auVar173._8_4_ = fVar234;
              auVar173._12_4_ = fVar234;
              auVar158._4_4_ = fVar247;
              auVar158._0_4_ = fVar247;
              auVar158._8_4_ = fVar247;
              auVar158._12_4_ = fVar247;
              auVar129._4_4_ = fVar248;
              auVar129._0_4_ = fVar248;
              auVar129._8_4_ = fVar248;
              auVar129._12_4_ = fVar248;
              fVar249 = fVar249 * fVar249 * fVar249;
              auVar188._0_4_ = (float)local_460._0_4_ * fVar249;
              auVar188._4_4_ = (float)local_460._4_4_ * fVar249;
              auVar188._8_4_ = fStack_458 * fVar249;
              auVar188._12_4_ = fStack_454 * fVar249;
              auVar75 = vfmadd231ps_fma(auVar188,auVar71,auVar129);
              auVar75 = vfmadd231ps_avx512vl(auVar75,auVar65,auVar158);
              auVar75 = vfmadd231ps_avx512vl(auVar75,auVar56,auVar173);
              auVar130._8_8_ = auVar75._0_8_;
              auVar130._0_8_ = auVar75._0_8_;
              auVar75 = vshufpd_avx(auVar75,auVar75,3);
              auVar57 = vshufps_avx(auVar64,auVar64,0x55);
              auVar75 = vsubps_avx(auVar75,auVar130);
              auVar57 = vfmadd213ps_fma(auVar75,auVar57,auVar130);
              fVar234 = auVar57._0_4_;
              auVar75 = vshufps_avx(auVar57,auVar57,0x55);
              auVar131._0_4_ = auVar54._0_4_ * fVar234 + fVar252 * auVar75._0_4_;
              auVar131._4_4_ = auVar54._4_4_ * fVar234 + auVar55._4_4_ * auVar75._4_4_;
              auVar131._8_4_ = auVar54._8_4_ * fVar234 + auVar55._8_4_ * auVar75._8_4_;
              auVar131._12_4_ = auVar54._12_4_ * fVar234 + auVar55._12_4_ * auVar75._12_4_;
              auVar64 = vsubps_avx(auVar64,auVar131);
              auVar75 = vandps_avx512vl(auVar57,auVar290._0_16_);
              auVar57 = vprolq_avx512vl(auVar75,0x20);
              auVar75 = vmaxss_avx(auVar57,auVar75);
              bVar21 = auVar75._0_4_ <= (float)local_470._0_4_;
              if (auVar75._0_4_ < (float)local_470._0_4_) {
                auVar54 = vucomiss_avx512f(auVar68);
                if (bVar21) {
                  auVar55 = vucomiss_avx512f(auVar54);
                  auVar292 = ZEXT1664(auVar55);
                  if (bVar21) {
                    vmovshdup_avx(auVar54);
                    auVar55 = vucomiss_avx512f(auVar68);
                    if (bVar21) {
                      auVar73 = vucomiss_avx512f(auVar55);
                      auVar292 = ZEXT1664(auVar73);
                      if (bVar21) {
                        auVar75 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                                ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),
                                                0x1c);
                        auVar63 = vinsertps_avx(auVar75,ZEXT416((uint)pre->ray_space[k].vz.field_0.
                                                                      m128[2]),0x28);
                        auVar75 = vdpps_avx(auVar63,local_2a0,0x7f);
                        auVar57 = vdpps_avx(auVar63,local_2b0,0x7f);
                        auVar58 = vdpps_avx(auVar63,local_2c0,0x7f);
                        auVar59 = vdpps_avx(auVar63,local_2d0,0x7f);
                        auVar60 = vdpps_avx(auVar63,local_2e0,0x7f);
                        auVar61 = vdpps_avx(auVar63,local_2f0,0x7f);
                        auVar62 = vdpps_avx(auVar63,local_300,0x7f);
                        auVar63 = vdpps_avx(auVar63,local_310,0x7f);
                        auVar64 = vsubss_avx512f(auVar73,auVar55);
                        fVar248 = auVar55._0_4_;
                        auVar55 = vfmadd231ss_fma(ZEXT416((uint)(fVar248 * auVar60._0_4_)),auVar64,
                                                  auVar75);
                        auVar75 = vfmadd231ss_fma(ZEXT416((uint)(auVar61._0_4_ * fVar248)),auVar64,
                                                  auVar57);
                        auVar57 = vfmadd231ss_fma(ZEXT416((uint)(auVar62._0_4_ * fVar248)),auVar64,
                                                  auVar58);
                        auVar58 = vfmadd231ss_fma(ZEXT416((uint)(fVar248 * auVar63._0_4_)),auVar64,
                                                  auVar59);
                        auVar73 = vsubss_avx512f(auVar73,auVar54);
                        auVar204._0_4_ = auVar73._0_4_;
                        fVar252 = auVar204._0_4_ * auVar204._0_4_ * auVar204._0_4_;
                        local_120 = auVar54._0_4_;
                        fVar234 = local_120 * 3.0 * auVar204._0_4_ * auVar204._0_4_;
                        fVar247 = auVar204._0_4_ * local_120 * local_120 * 3.0;
                        fVar250 = local_120 * local_120 * local_120;
                        auVar73 = vfmadd231ss_fma(ZEXT416((uint)(fVar250 * auVar58._0_4_)),
                                                  ZEXT416((uint)fVar247),auVar57);
                        auVar73 = vfmadd231ss_fma(auVar73,ZEXT416((uint)fVar234),auVar75);
                        auVar55 = vfmadd231ss_fma(auVar73,ZEXT416((uint)fVar252),auVar55);
                        fVar249 = auVar55._0_4_;
                        if ((fVar116 <= fVar249) &&
                           (fVar251 = *(float *)(ray + k * 4 + 0x100), fVar249 <= fVar251)) {
                          auVar55 = vshufps_avx(auVar54,auVar54,0x55);
                          auVar57 = vsubps_avx512vl(auVar141,auVar55);
                          fVar206 = auVar55._0_4_;
                          auVar245._0_4_ = fVar206 * (float)local_360._0_4_;
                          fVar224 = auVar55._4_4_;
                          auVar245._4_4_ = fVar224 * (float)local_360._4_4_;
                          fVar225 = auVar55._8_4_;
                          auVar245._8_4_ = fVar225 * fStack_358;
                          fVar226 = auVar55._12_4_;
                          auVar245._12_4_ = fVar226 * fStack_354;
                          auVar259._0_4_ = fVar206 * (float)local_370._0_4_;
                          auVar259._4_4_ = fVar224 * (float)local_370._4_4_;
                          auVar259._8_4_ = fVar225 * fStack_368;
                          auVar259._12_4_ = fVar226 * fStack_364;
                          auVar268._0_4_ = fVar206 * (float)local_380._0_4_;
                          auVar268._4_4_ = fVar224 * (float)local_380._4_4_;
                          auVar268._8_4_ = fVar225 * fStack_378;
                          auVar268._12_4_ = fVar226 * fStack_374;
                          auVar221._0_4_ = fVar206 * (float)local_390._0_4_;
                          auVar221._4_4_ = fVar224 * (float)local_390._4_4_;
                          auVar221._8_4_ = fVar225 * fStack_388;
                          auVar221._12_4_ = fVar226 * fStack_384;
                          auVar55 = vfmadd231ps_fma(auVar245,auVar57,local_320);
                          auVar73 = vfmadd231ps_fma(auVar259,auVar57,local_330);
                          auVar75 = vfmadd231ps_fma(auVar268,auVar57,local_340);
                          auVar57 = vfmadd231ps_fma(auVar221,auVar57,local_350);
                          auVar55 = vsubps_avx(auVar73,auVar55);
                          auVar73 = vsubps_avx(auVar75,auVar73);
                          auVar75 = vsubps_avx(auVar57,auVar75);
                          auVar269._0_4_ = local_120 * auVar73._0_4_;
                          auVar269._4_4_ = local_120 * auVar73._4_4_;
                          auVar269._8_4_ = local_120 * auVar73._8_4_;
                          auVar269._12_4_ = local_120 * auVar73._12_4_;
                          auVar204._4_4_ = auVar204._0_4_;
                          auVar204._8_4_ = auVar204._0_4_;
                          auVar204._12_4_ = auVar204._0_4_;
                          auVar55 = vfmadd231ps_fma(auVar269,auVar204,auVar55);
                          auVar222._0_4_ = local_120 * auVar75._0_4_;
                          auVar222._4_4_ = local_120 * auVar75._4_4_;
                          auVar222._8_4_ = local_120 * auVar75._8_4_;
                          auVar222._12_4_ = local_120 * auVar75._12_4_;
                          auVar73 = vfmadd231ps_fma(auVar222,auVar204,auVar73);
                          auVar223._0_4_ = local_120 * auVar73._0_4_;
                          auVar223._4_4_ = local_120 * auVar73._4_4_;
                          auVar223._8_4_ = local_120 * auVar73._8_4_;
                          auVar223._12_4_ = local_120 * auVar73._12_4_;
                          auVar55 = vfmadd231ps_fma(auVar223,auVar204,auVar55);
                          auVar29._8_4_ = 0x40400000;
                          auVar29._0_8_ = 0x4040000040400000;
                          auVar29._12_4_ = 0x40400000;
                          auVar55 = vmulps_avx512vl(auVar55,auVar29);
                          pGVar8 = (context->scene->geometries).items[uVar52].ptr;
                          if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                            auVar189._0_4_ = fVar250 * (float)local_3d0._0_4_;
                            auVar189._4_4_ = fVar250 * (float)local_3d0._4_4_;
                            auVar189._8_4_ = fVar250 * fStack_3c8;
                            auVar189._12_4_ = fVar250 * fStack_3c4;
                            auVar174._4_4_ = fVar247;
                            auVar174._0_4_ = fVar247;
                            auVar174._8_4_ = fVar247;
                            auVar174._12_4_ = fVar247;
                            auVar73 = vfmadd132ps_fma(auVar174,auVar189,local_3c0);
                            auVar159._4_4_ = fVar234;
                            auVar159._0_4_ = fVar234;
                            auVar159._8_4_ = fVar234;
                            auVar159._12_4_ = fVar234;
                            auVar73 = vfmadd132ps_fma(auVar159,auVar73,local_3b0);
                            auVar147._4_4_ = fVar252;
                            auVar147._0_4_ = fVar252;
                            auVar147._8_4_ = fVar252;
                            auVar147._12_4_ = fVar252;
                            auVar57 = vfmadd132ps_fma(auVar147,auVar73,local_3a0);
                            auVar73 = vshufps_avx(auVar57,auVar57,0xc9);
                            auVar75 = vshufps_avx(auVar55,auVar55,0xc9);
                            auVar148._0_4_ = auVar57._0_4_ * auVar75._0_4_;
                            auVar148._4_4_ = auVar57._4_4_ * auVar75._4_4_;
                            auVar148._8_4_ = auVar57._8_4_ * auVar75._8_4_;
                            auVar148._12_4_ = auVar57._12_4_ * auVar75._12_4_;
                            auVar55 = vfmsub231ps_fma(auVar148,auVar55,auVar73);
                            local_140 = auVar55._0_4_;
                            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                               (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                              *(float *)(ray + k * 4 + 0x100) = fVar249;
                              uVar117 = vextractps_avx(auVar55,1);
                              *(undefined4 *)(ray + k * 4 + 0x180) = uVar117;
                              uVar117 = vextractps_avx(auVar55,2);
                              *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar117;
                              *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
                              *(float *)(ray + k * 4 + 0x1e0) = local_120;
                              *(float *)(ray + k * 4 + 0x200) = fVar248;
                              *(uint *)(ray + k * 4 + 0x220) = uVar6;
                              *(uint *)(ray + k * 4 + 0x240) = uVar52;
                              *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                              *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                            }
                            else {
                              auVar162._8_4_ = 1;
                              auVar162._0_8_ = 0x100000001;
                              auVar162._12_4_ = 1;
                              auVar162._16_4_ = 1;
                              auVar162._20_4_ = 1;
                              auVar162._24_4_ = 1;
                              auVar162._28_4_ = 1;
                              local_100 = vpermps_avx2(auVar162,ZEXT1632(auVar54));
                              auVar91 = vpermps_avx2(auVar162,ZEXT1632(auVar55));
                              auVar175._8_4_ = 2;
                              auVar175._0_8_ = 0x200000002;
                              auVar175._12_4_ = 2;
                              auVar175._16_4_ = 2;
                              auVar175._20_4_ = 2;
                              auVar175._24_4_ = 2;
                              auVar175._28_4_ = 2;
                              local_160 = vpermps_avx2(auVar175,ZEXT1632(auVar55));
                              local_180[0] = (RTCHitN)auVar91[0];
                              local_180[1] = (RTCHitN)auVar91[1];
                              local_180[2] = (RTCHitN)auVar91[2];
                              local_180[3] = (RTCHitN)auVar91[3];
                              local_180[4] = (RTCHitN)auVar91[4];
                              local_180[5] = (RTCHitN)auVar91[5];
                              local_180[6] = (RTCHitN)auVar91[6];
                              local_180[7] = (RTCHitN)auVar91[7];
                              local_180[8] = (RTCHitN)auVar91[8];
                              local_180[9] = (RTCHitN)auVar91[9];
                              local_180[10] = (RTCHitN)auVar91[10];
                              local_180[0xb] = (RTCHitN)auVar91[0xb];
                              local_180[0xc] = (RTCHitN)auVar91[0xc];
                              local_180[0xd] = (RTCHitN)auVar91[0xd];
                              local_180[0xe] = (RTCHitN)auVar91[0xe];
                              local_180[0xf] = (RTCHitN)auVar91[0xf];
                              local_180[0x10] = (RTCHitN)auVar91[0x10];
                              local_180[0x11] = (RTCHitN)auVar91[0x11];
                              local_180[0x12] = (RTCHitN)auVar91[0x12];
                              local_180[0x13] = (RTCHitN)auVar91[0x13];
                              local_180[0x14] = (RTCHitN)auVar91[0x14];
                              local_180[0x15] = (RTCHitN)auVar91[0x15];
                              local_180[0x16] = (RTCHitN)auVar91[0x16];
                              local_180[0x17] = (RTCHitN)auVar91[0x17];
                              local_180[0x18] = (RTCHitN)auVar91[0x18];
                              local_180[0x19] = (RTCHitN)auVar91[0x19];
                              local_180[0x1a] = (RTCHitN)auVar91[0x1a];
                              local_180[0x1b] = (RTCHitN)auVar91[0x1b];
                              local_180[0x1c] = (RTCHitN)auVar91[0x1c];
                              local_180[0x1d] = (RTCHitN)auVar91[0x1d];
                              local_180[0x1e] = (RTCHitN)auVar91[0x1e];
                              local_180[0x1f] = (RTCHitN)auVar91[0x1f];
                              uStack_13c = local_140;
                              uStack_138 = local_140;
                              uStack_134 = local_140;
                              uStack_130 = local_140;
                              uStack_12c = local_140;
                              uStack_128 = local_140;
                              uStack_124 = local_140;
                              fStack_11c = local_120;
                              fStack_118 = local_120;
                              fStack_114 = local_120;
                              fStack_110 = local_120;
                              fStack_10c = local_120;
                              fStack_108 = local_120;
                              fStack_104 = local_120;
                              local_e0 = local_220._0_8_;
                              uStack_d8 = local_220._8_8_;
                              uStack_d0 = local_220._16_8_;
                              uStack_c8 = local_220._24_8_;
                              local_c0 = local_200;
                              vpcmpeqd_avx2(local_200,local_200);
                              uStack_9c = context->user->instID[0];
                              local_a0 = uStack_9c;
                              uStack_98 = uStack_9c;
                              uStack_94 = uStack_9c;
                              uStack_90 = uStack_9c;
                              uStack_8c = uStack_9c;
                              uStack_88 = uStack_9c;
                              uStack_84 = uStack_9c;
                              uStack_7c = context->user->instPrimID[0];
                              local_80 = uStack_7c;
                              uStack_78 = uStack_7c;
                              uStack_74 = uStack_7c;
                              uStack_70 = uStack_7c;
                              uStack_6c = uStack_7c;
                              uStack_68 = uStack_7c;
                              uStack_64 = uStack_7c;
                              *(float *)(ray + k * 4 + 0x100) = fVar249;
                              local_400 = local_240._0_8_;
                              uStack_3f8 = local_240._8_8_;
                              uStack_3f0 = local_240._16_8_;
                              uStack_3e8 = local_240._24_8_;
                              local_4a0.valid = (int *)&local_400;
                              local_4a0.geometryUserPtr = pGVar8->userPtr;
                              local_4a0.context = context->user;
                              local_4a0.hit = local_180;
                              local_4a0.N = 8;
                              local_4a0.ray = (RTCRayN *)ray;
                              if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                                (*pGVar8->intersectionFilterN)(&local_4a0);
                                in_ZMM23 = ZEXT464(0x38d1b717);
                                auVar95 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar289 = ZEXT3264(auVar95);
                                auVar292 = ZEXT464(0x3f800000);
                                auVar54 = vxorps_avx512vl(auVar68,auVar68);
                                auVar295 = ZEXT1664(auVar54);
                                auVar54 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar290 = ZEXT1664(auVar54);
                              }
                              auVar54 = auVar295._0_16_;
                              auVar42._8_8_ = uStack_3f8;
                              auVar42._0_8_ = local_400;
                              auVar42._16_8_ = uStack_3f0;
                              auVar42._24_8_ = uStack_3e8;
                              if (auVar42 == (undefined1  [32])0x0) {
LAB_01c6036b:
                                *(float *)(ray + k * 4 + 0x100) = fVar251;
                              }
                              else {
                                p_Var13 = context->args->filter;
                                if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                                  (*p_Var13)(&local_4a0);
                                  in_ZMM23 = ZEXT464(0x38d1b717);
                                  auVar95 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar289 = ZEXT3264(auVar95);
                                  auVar292 = ZEXT464(0x3f800000);
                                  auVar54 = vxorps_avx512vl(auVar54,auVar54);
                                  auVar295 = ZEXT1664(auVar54);
                                  auVar54 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar290 = ZEXT1664(auVar54);
                                }
                                auVar43._8_8_ = uStack_3f8;
                                auVar43._0_8_ = local_400;
                                auVar43._16_8_ = uStack_3f0;
                                auVar43._24_8_ = uStack_3e8;
                                if (auVar43 == (undefined1  [32])0x0) goto LAB_01c6036b;
                                uVar51 = vptestmd_avx512vl(auVar43,auVar43);
                                iVar115 = *(int *)(local_4a0.hit + 4);
                                iVar294 = *(int *)(local_4a0.hit + 8);
                                iVar37 = *(int *)(local_4a0.hit + 0xc);
                                iVar38 = *(int *)(local_4a0.hit + 0x10);
                                iVar39 = *(int *)(local_4a0.hit + 0x14);
                                iVar40 = *(int *)(local_4a0.hit + 0x18);
                                iVar41 = *(int *)(local_4a0.hit + 0x1c);
                                bVar44 = (byte)uVar51;
                                bVar21 = (bool)((byte)(uVar51 >> 1) & 1);
                                bVar15 = (bool)((byte)(uVar51 >> 2) & 1);
                                bVar16 = (bool)((byte)(uVar51 >> 3) & 1);
                                bVar17 = (bool)((byte)(uVar51 >> 4) & 1);
                                bVar18 = (bool)((byte)(uVar51 >> 5) & 1);
                                bVar19 = (bool)((byte)(uVar51 >> 6) & 1);
                                bVar20 = SUB81(uVar51 >> 7,0);
                                *(uint *)(local_4a0.ray + 0x180) =
                                     (uint)(bVar44 & 1) * *(int *)local_4a0.hit |
                                     (uint)!(bool)(bVar44 & 1) * *(int *)(local_4a0.ray + 0x180);
                                *(uint *)(local_4a0.ray + 0x184) =
                                     (uint)bVar21 * iVar115 |
                                     (uint)!bVar21 * *(int *)(local_4a0.ray + 0x184);
                                *(uint *)(local_4a0.ray + 0x188) =
                                     (uint)bVar15 * iVar294 |
                                     (uint)!bVar15 * *(int *)(local_4a0.ray + 0x188);
                                *(uint *)(local_4a0.ray + 0x18c) =
                                     (uint)bVar16 * iVar37 |
                                     (uint)!bVar16 * *(int *)(local_4a0.ray + 0x18c);
                                *(uint *)(local_4a0.ray + 400) =
                                     (uint)bVar17 * iVar38 |
                                     (uint)!bVar17 * *(int *)(local_4a0.ray + 400);
                                *(uint *)(local_4a0.ray + 0x194) =
                                     (uint)bVar18 * iVar39 |
                                     (uint)!bVar18 * *(int *)(local_4a0.ray + 0x194);
                                *(uint *)(local_4a0.ray + 0x198) =
                                     (uint)bVar19 * iVar40 |
                                     (uint)!bVar19 * *(int *)(local_4a0.ray + 0x198);
                                *(uint *)(local_4a0.ray + 0x19c) =
                                     (uint)bVar20 * iVar41 |
                                     (uint)!bVar20 * *(int *)(local_4a0.ray + 0x19c);
                                iVar115 = *(int *)(local_4a0.hit + 0x24);
                                iVar294 = *(int *)(local_4a0.hit + 0x28);
                                iVar37 = *(int *)(local_4a0.hit + 0x2c);
                                iVar38 = *(int *)(local_4a0.hit + 0x30);
                                iVar39 = *(int *)(local_4a0.hit + 0x34);
                                iVar40 = *(int *)(local_4a0.hit + 0x38);
                                iVar41 = *(int *)(local_4a0.hit + 0x3c);
                                bVar21 = (bool)((byte)(uVar51 >> 1) & 1);
                                bVar15 = (bool)((byte)(uVar51 >> 2) & 1);
                                bVar16 = (bool)((byte)(uVar51 >> 3) & 1);
                                bVar17 = (bool)((byte)(uVar51 >> 4) & 1);
                                bVar18 = (bool)((byte)(uVar51 >> 5) & 1);
                                bVar19 = (bool)((byte)(uVar51 >> 6) & 1);
                                bVar20 = SUB81(uVar51 >> 7,0);
                                *(uint *)(local_4a0.ray + 0x1a0) =
                                     (uint)(bVar44 & 1) * *(int *)(local_4a0.hit + 0x20) |
                                     (uint)!(bool)(bVar44 & 1) * *(int *)(local_4a0.ray + 0x1a0);
                                *(uint *)(local_4a0.ray + 0x1a4) =
                                     (uint)bVar21 * iVar115 |
                                     (uint)!bVar21 * *(int *)(local_4a0.ray + 0x1a4);
                                *(uint *)(local_4a0.ray + 0x1a8) =
                                     (uint)bVar15 * iVar294 |
                                     (uint)!bVar15 * *(int *)(local_4a0.ray + 0x1a8);
                                *(uint *)(local_4a0.ray + 0x1ac) =
                                     (uint)bVar16 * iVar37 |
                                     (uint)!bVar16 * *(int *)(local_4a0.ray + 0x1ac);
                                *(uint *)(local_4a0.ray + 0x1b0) =
                                     (uint)bVar17 * iVar38 |
                                     (uint)!bVar17 * *(int *)(local_4a0.ray + 0x1b0);
                                *(uint *)(local_4a0.ray + 0x1b4) =
                                     (uint)bVar18 * iVar39 |
                                     (uint)!bVar18 * *(int *)(local_4a0.ray + 0x1b4);
                                *(uint *)(local_4a0.ray + 0x1b8) =
                                     (uint)bVar19 * iVar40 |
                                     (uint)!bVar19 * *(int *)(local_4a0.ray + 0x1b8);
                                *(uint *)(local_4a0.ray + 0x1bc) =
                                     (uint)bVar20 * iVar41 |
                                     (uint)!bVar20 * *(int *)(local_4a0.ray + 0x1bc);
                                iVar115 = *(int *)(local_4a0.hit + 0x44);
                                iVar294 = *(int *)(local_4a0.hit + 0x48);
                                iVar37 = *(int *)(local_4a0.hit + 0x4c);
                                iVar38 = *(int *)(local_4a0.hit + 0x50);
                                iVar39 = *(int *)(local_4a0.hit + 0x54);
                                iVar40 = *(int *)(local_4a0.hit + 0x58);
                                iVar41 = *(int *)(local_4a0.hit + 0x5c);
                                bVar21 = (bool)((byte)(uVar51 >> 1) & 1);
                                bVar15 = (bool)((byte)(uVar51 >> 2) & 1);
                                bVar16 = (bool)((byte)(uVar51 >> 3) & 1);
                                bVar17 = (bool)((byte)(uVar51 >> 4) & 1);
                                bVar18 = (bool)((byte)(uVar51 >> 5) & 1);
                                bVar19 = (bool)((byte)(uVar51 >> 6) & 1);
                                bVar20 = SUB81(uVar51 >> 7,0);
                                *(uint *)(local_4a0.ray + 0x1c0) =
                                     (uint)(bVar44 & 1) * *(int *)(local_4a0.hit + 0x40) |
                                     (uint)!(bool)(bVar44 & 1) * *(int *)(local_4a0.ray + 0x1c0);
                                *(uint *)(local_4a0.ray + 0x1c4) =
                                     (uint)bVar21 * iVar115 |
                                     (uint)!bVar21 * *(int *)(local_4a0.ray + 0x1c4);
                                *(uint *)(local_4a0.ray + 0x1c8) =
                                     (uint)bVar15 * iVar294 |
                                     (uint)!bVar15 * *(int *)(local_4a0.ray + 0x1c8);
                                *(uint *)(local_4a0.ray + 0x1cc) =
                                     (uint)bVar16 * iVar37 |
                                     (uint)!bVar16 * *(int *)(local_4a0.ray + 0x1cc);
                                *(uint *)(local_4a0.ray + 0x1d0) =
                                     (uint)bVar17 * iVar38 |
                                     (uint)!bVar17 * *(int *)(local_4a0.ray + 0x1d0);
                                *(uint *)(local_4a0.ray + 0x1d4) =
                                     (uint)bVar18 * iVar39 |
                                     (uint)!bVar18 * *(int *)(local_4a0.ray + 0x1d4);
                                *(uint *)(local_4a0.ray + 0x1d8) =
                                     (uint)bVar19 * iVar40 |
                                     (uint)!bVar19 * *(int *)(local_4a0.ray + 0x1d8);
                                *(uint *)(local_4a0.ray + 0x1dc) =
                                     (uint)bVar20 * iVar41 |
                                     (uint)!bVar20 * *(int *)(local_4a0.ray + 0x1dc);
                                iVar115 = *(int *)(local_4a0.hit + 100);
                                iVar294 = *(int *)(local_4a0.hit + 0x68);
                                iVar37 = *(int *)(local_4a0.hit + 0x6c);
                                iVar38 = *(int *)(local_4a0.hit + 0x70);
                                iVar39 = *(int *)(local_4a0.hit + 0x74);
                                iVar40 = *(int *)(local_4a0.hit + 0x78);
                                iVar41 = *(int *)(local_4a0.hit + 0x7c);
                                bVar21 = (bool)((byte)(uVar51 >> 1) & 1);
                                bVar15 = (bool)((byte)(uVar51 >> 2) & 1);
                                bVar16 = (bool)((byte)(uVar51 >> 3) & 1);
                                bVar17 = (bool)((byte)(uVar51 >> 4) & 1);
                                bVar18 = (bool)((byte)(uVar51 >> 5) & 1);
                                bVar19 = (bool)((byte)(uVar51 >> 6) & 1);
                                bVar20 = SUB81(uVar51 >> 7,0);
                                *(uint *)(local_4a0.ray + 0x1e0) =
                                     (uint)(bVar44 & 1) * *(int *)(local_4a0.hit + 0x60) |
                                     (uint)!(bool)(bVar44 & 1) * *(int *)(local_4a0.ray + 0x1e0);
                                *(uint *)(local_4a0.ray + 0x1e4) =
                                     (uint)bVar21 * iVar115 |
                                     (uint)!bVar21 * *(int *)(local_4a0.ray + 0x1e4);
                                *(uint *)(local_4a0.ray + 0x1e8) =
                                     (uint)bVar15 * iVar294 |
                                     (uint)!bVar15 * *(int *)(local_4a0.ray + 0x1e8);
                                *(uint *)(local_4a0.ray + 0x1ec) =
                                     (uint)bVar16 * iVar37 |
                                     (uint)!bVar16 * *(int *)(local_4a0.ray + 0x1ec);
                                *(uint *)(local_4a0.ray + 0x1f0) =
                                     (uint)bVar17 * iVar38 |
                                     (uint)!bVar17 * *(int *)(local_4a0.ray + 0x1f0);
                                *(uint *)(local_4a0.ray + 500) =
                                     (uint)bVar18 * iVar39 |
                                     (uint)!bVar18 * *(int *)(local_4a0.ray + 500);
                                *(uint *)(local_4a0.ray + 0x1f8) =
                                     (uint)bVar19 * iVar40 |
                                     (uint)!bVar19 * *(int *)(local_4a0.ray + 0x1f8);
                                *(uint *)(local_4a0.ray + 0x1fc) =
                                     (uint)bVar20 * iVar41 |
                                     (uint)!bVar20 * *(int *)(local_4a0.ray + 0x1fc);
                                iVar115 = *(int *)(local_4a0.ray + 0x204);
                                iVar294 = *(int *)(local_4a0.ray + 0x208);
                                iVar37 = *(int *)(local_4a0.ray + 0x20c);
                                iVar38 = *(int *)(local_4a0.ray + 0x210);
                                iVar39 = *(int *)(local_4a0.ray + 0x214);
                                iVar40 = *(int *)(local_4a0.ray + 0x218);
                                iVar41 = *(int *)(local_4a0.ray + 0x21c);
                                auVar109._0_4_ =
                                     (uint)(bVar44 & 1) * *(int *)(local_4a0.hit + 0x80) |
                                     (uint)!(bool)(bVar44 & 1) * *(int *)(local_4a0.ray + 0x200);
                                bVar21 = (bool)((byte)(uVar51 >> 1) & 1);
                                auVar109._4_4_ =
                                     (uint)bVar21 * *(int *)(local_4a0.hit + 0x84) |
                                     (uint)!bVar21 * iVar115;
                                bVar21 = (bool)((byte)(uVar51 >> 2) & 1);
                                auVar109._8_4_ =
                                     (uint)bVar21 * *(int *)(local_4a0.hit + 0x88) |
                                     (uint)!bVar21 * iVar294;
                                bVar21 = (bool)((byte)(uVar51 >> 3) & 1);
                                auVar109._12_4_ =
                                     (uint)bVar21 * *(int *)(local_4a0.hit + 0x8c) |
                                     (uint)!bVar21 * iVar37;
                                bVar21 = (bool)((byte)(uVar51 >> 4) & 1);
                                auVar109._16_4_ =
                                     (uint)bVar21 * *(int *)(local_4a0.hit + 0x90) |
                                     (uint)!bVar21 * iVar38;
                                bVar21 = (bool)((byte)(uVar51 >> 5) & 1);
                                auVar109._20_4_ =
                                     (uint)bVar21 * *(int *)(local_4a0.hit + 0x94) |
                                     (uint)!bVar21 * iVar39;
                                bVar21 = (bool)((byte)(uVar51 >> 6) & 1);
                                auVar109._24_4_ =
                                     (uint)bVar21 * *(int *)(local_4a0.hit + 0x98) |
                                     (uint)!bVar21 * iVar40;
                                bVar21 = SUB81(uVar51 >> 7,0);
                                auVar109._28_4_ =
                                     (uint)bVar21 * *(int *)(local_4a0.hit + 0x9c) |
                                     (uint)!bVar21 * iVar41;
                                *(undefined1 (*) [32])(local_4a0.ray + 0x200) = auVar109;
                                bVar21 = (bool)((byte)(uVar51 >> 1) & 1);
                                uVar114 = bVar21 * auVar109._4_4_ | (uint)!bVar21 * iVar115;
                                auVar33._4_24_ = auVar109._8_24_;
                                auVar33._0_4_ = uVar114;
                                auVar110._0_8_ = auVar33._0_8_ << 0x20;
                                bVar21 = (bool)((byte)(uVar51 >> 2) & 1);
                                auVar110._8_4_ = bVar21 * auVar109._8_4_ | (uint)!bVar21 * iVar294;
                                bVar21 = (bool)((byte)(uVar51 >> 3) & 1);
                                auVar110._12_4_ = bVar21 * auVar109._12_4_ | (uint)!bVar21 * iVar37;
                                bVar21 = (bool)((byte)(uVar51 >> 4) & 1);
                                auVar110._16_4_ = bVar21 * auVar109._16_4_ | (uint)!bVar21 * iVar38;
                                bVar21 = (bool)((byte)(uVar51 >> 5) & 1);
                                auVar110._20_4_ = bVar21 * auVar109._20_4_ | (uint)!bVar21 * iVar39;
                                bVar21 = (bool)((byte)(uVar51 >> 6) & 1);
                                auVar110._24_4_ = bVar21 * auVar109._24_4_ | (uint)!bVar21 * iVar40;
                                bVar21 = SUB81(uVar51 >> 7,0);
                                auVar110._28_4_ = bVar21 * auVar109._28_4_ | (uint)!bVar21 * iVar41;
                                auVar95 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                              (local_4a0.hit + 0xa0));
                                *(undefined1 (*) [32])(local_4a0.ray + 0x220) = auVar95;
                                bVar21 = (bool)((byte)(uVar51 >> 1) & 1);
                                uVar114 = bVar21 * uVar114 | (uint)!bVar21 * iVar115;
                                auVar34._4_24_ = auVar110._8_24_;
                                auVar34._0_4_ = uVar114;
                                auVar111._0_8_ = auVar34._0_8_ << 0x20;
                                bVar21 = (bool)((byte)(uVar51 >> 2) & 1);
                                auVar111._8_4_ = bVar21 * auVar110._8_4_ | (uint)!bVar21 * iVar294;
                                bVar21 = (bool)((byte)(uVar51 >> 3) & 1);
                                auVar111._12_4_ = bVar21 * auVar110._12_4_ | (uint)!bVar21 * iVar37;
                                bVar21 = (bool)((byte)(uVar51 >> 4) & 1);
                                auVar111._16_4_ = bVar21 * auVar110._16_4_ | (uint)!bVar21 * iVar38;
                                bVar21 = (bool)((byte)(uVar51 >> 5) & 1);
                                auVar111._20_4_ = bVar21 * auVar110._20_4_ | (uint)!bVar21 * iVar39;
                                bVar21 = (bool)((byte)(uVar51 >> 6) & 1);
                                auVar111._24_4_ = bVar21 * auVar110._24_4_ | (uint)!bVar21 * iVar40;
                                bVar21 = SUB81(uVar51 >> 7,0);
                                auVar111._28_4_ = bVar21 * auVar110._28_4_ | (uint)!bVar21 * iVar41;
                                auVar95 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                              (local_4a0.hit + 0xc0));
                                *(undefined1 (*) [32])(local_4a0.ray + 0x240) = auVar95;
                                bVar21 = (bool)((byte)(uVar51 >> 1) & 1);
                                uVar114 = bVar21 * uVar114 | (uint)!bVar21 * iVar115;
                                auVar35._4_24_ = auVar111._8_24_;
                                auVar35._0_4_ = uVar114;
                                auVar112._0_8_ = auVar35._0_8_ << 0x20;
                                bVar21 = (bool)((byte)(uVar51 >> 2) & 1);
                                auVar112._8_4_ = bVar21 * auVar111._8_4_ | (uint)!bVar21 * iVar294;
                                bVar21 = (bool)((byte)(uVar51 >> 3) & 1);
                                auVar112._12_4_ = bVar21 * auVar111._12_4_ | (uint)!bVar21 * iVar37;
                                bVar21 = (bool)((byte)(uVar51 >> 4) & 1);
                                auVar112._16_4_ = bVar21 * auVar111._16_4_ | (uint)!bVar21 * iVar38;
                                bVar21 = (bool)((byte)(uVar51 >> 5) & 1);
                                auVar112._20_4_ = bVar21 * auVar111._20_4_ | (uint)!bVar21 * iVar39;
                                bVar21 = (bool)((byte)(uVar51 >> 6) & 1);
                                auVar112._24_4_ = bVar21 * auVar111._24_4_ | (uint)!bVar21 * iVar40;
                                bVar21 = SUB81(uVar51 >> 7,0);
                                auVar112._28_4_ = bVar21 * auVar111._28_4_ | (uint)!bVar21 * iVar41;
                                auVar95 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                              (local_4a0.hit + 0xe0));
                                *(undefined1 (*) [32])(local_4a0.ray + 0x260) = auVar95;
                                bVar21 = (bool)((byte)(uVar51 >> 1) & 1);
                                auVar36._4_24_ = auVar112._8_24_;
                                auVar36._0_4_ = bVar21 * uVar114 | (uint)!bVar21 * iVar115;
                                auVar113._0_8_ = auVar36._0_8_ << 0x20;
                                bVar21 = (bool)((byte)(uVar51 >> 2) & 1);
                                auVar113._8_4_ = bVar21 * auVar112._8_4_ | (uint)!bVar21 * iVar294;
                                bVar21 = (bool)((byte)(uVar51 >> 3) & 1);
                                auVar113._12_4_ = bVar21 * auVar112._12_4_ | (uint)!bVar21 * iVar37;
                                bVar21 = (bool)((byte)(uVar51 >> 4) & 1);
                                auVar113._16_4_ = bVar21 * auVar112._16_4_ | (uint)!bVar21 * iVar38;
                                bVar21 = (bool)((byte)(uVar51 >> 5) & 1);
                                auVar113._20_4_ = bVar21 * auVar112._20_4_ | (uint)!bVar21 * iVar39;
                                bVar21 = (bool)((byte)(uVar51 >> 6) & 1);
                                auVar113._24_4_ = bVar21 * auVar112._24_4_ | (uint)!bVar21 * iVar40;
                                bVar21 = SUB81(uVar51 >> 7,0);
                                auVar113._28_4_ = bVar21 * auVar112._28_4_ | (uint)!bVar21 * iVar41;
                                auVar95._16_16_ = auVar113._16_16_;
                                auVar91 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                              (local_4a0.hit + 0x100));
                                *(undefined1 (*) [32])(local_4a0.ray + 0x280) = auVar91;
                              }
                              auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                              auVar291 = ZEXT1664(auVar54);
                            }
                            auVar288 = ZEXT1664(auVar72);
                          }
                        }
                      }
                    }
                  }
                }
                break;
              }
              lVar49 = lVar49 + -1;
            } while (lVar49 != 0);
          }
        }
        else {
          auVar291 = ZEXT1664(auVar141);
        }
      }
    } while (bVar14);
    auVar54 = vinsertps_avx(auVar69,auVar70,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }